

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall Spaghetti<RemSP>::PerformLabeling(Spaghetti<RemSP> *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  ulong uVar49;
  int local_180;
  ulong local_140;
  long local_118;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar2 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  uVar11 = (ulong)(int)uVar3;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar48 = uVar2 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar7 = (uint *)operator_new__((ulong)(((*(int *)&pMVar4->field_0xc -
                                           (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar4->field_0x8 -
                                           (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  RemSP::P_ = puVar7;
  *puVar7 = 0;
  RemSP::length_ = 1;
  lVar45 = *(long *)&pMVar4->field_0x10;
  if (uVar2 == 1) {
    lVar46 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar23 = uVar3 - 2;
    uVar40 = 0;
    if (2 < (int)uVar3) {
      uVar38 = 0xfffffffe;
      uVar25 = 0;
LAB_001589c1:
      uVar40 = (uint)uVar25;
      if (*(char *)(lVar45 + (int)uVar40) == '\0') goto LAB_001589f1;
      cVar1 = *(char *)(lVar45 + 3 + (long)(int)uVar38);
      puVar7[RemSP::length_] = RemSP::length_;
      uVar38 = RemSP::length_ + 1;
      *(uint *)(lVar46 + (long)(int)uVar40 * 4) = RemSP::length_;
      RemSP::length_ = uVar38;
      uVar38 = uVar40;
      if (cVar1 == '\0') goto LAB_00158a70;
      while( true ) {
        uVar38 = (int)uVar25 + 2;
        if ((int)uVar23 <= (int)uVar38) break;
        uVar26 = (long)(int)uVar25;
        while (*(char *)(lVar45 + 2 + uVar26) != '\0') {
          if (*(char *)(lVar45 + 3 + uVar26) == '\0') {
            uVar10 = *(undefined4 *)(lVar46 + uVar26 * 4);
            lVar33 = uVar26 + 2;
            goto LAB_00158a6c;
          }
          *(undefined4 *)(lVar46 + 8 + uVar26 * 4) = *(undefined4 *)(lVar46 + uVar26 * 4);
          uVar25 = uVar26 + 2;
          uVar38 = uVar38 + 2;
          lVar33 = uVar26 + 4;
          uVar26 = uVar25;
          if ((long)(ulong)uVar23 <= lVar33) goto LAB_00158cf4;
        }
        uVar25 = (ulong)uVar38;
LAB_001589f1:
        uVar38 = (uint)uVar25;
        lVar33 = (long)(int)uVar38;
        if (*(char *)(lVar45 + 1 + lVar33) == '\0') goto LAB_00158a57;
        puVar7[RemSP::length_] = RemSP::length_;
        uVar40 = RemSP::length_ + 1;
        *(uint *)(lVar46 + lVar33 * 4) = RemSP::length_;
        RemSP::length_ = uVar40;
      }
LAB_00158cf4:
      lVar33 = (long)(int)uVar38;
      if ((int)uVar23 < (int)uVar38) {
        if (*(char *)(lVar45 + lVar33) == '\0') goto LAB_00158de5;
      }
      else if (*(char *)(lVar45 + lVar33) == '\0') goto LAB_00158dc8;
      *(undefined4 *)(lVar46 + lVar33 * 4) = *(undefined4 *)(lVar46 + (long)(int)uVar25 * 4);
      goto LAB_0015d084;
    }
LAB_00158a7f:
    lVar33 = (long)(int)uVar40;
    cVar1 = *(char *)(lVar45 + lVar33);
    if ((int)uVar23 < (int)uVar40) {
joined_r0x00158dce:
      if (cVar1 == '\0') {
LAB_00158de5:
        *(undefined4 *)(lVar46 + lVar33 * 4) = 0;
        goto LAB_0015d084;
      }
    }
    else if (cVar1 == '\0') {
LAB_00158dc8:
      cVar1 = *(char *)(lVar45 + 1 + lVar33);
      goto joined_r0x00158dce;
    }
    puVar7[RemSP::length_] = RemSP::length_;
    uVar40 = RemSP::length_ + 1;
    *(uint *)(lVar46 + lVar33 * 4) = RemSP::length_;
    RemSP::length_ = uVar40;
  }
  else {
    lVar33 = **(long **)&pMVar4->field_0x48;
    lVar46 = lVar45 + lVar33;
    lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar25 = uVar11 - 2;
    uVar26 = 0;
    local_180 = (int)uVar25;
    if (2 < (int)uVar3) {
      uVar26 = 0;
      do {
        lVar17 = (long)(int)uVar26;
        if (*(char *)(lVar45 + lVar17) != '\0') goto LAB_00158c73;
        if (*(char *)(lVar46 + lVar17) != '\0') goto LAB_00158c73;
LAB_00158b19:
        iVar27 = (int)uVar26;
        uVar21 = (ulong)iVar27;
        if ((*(char *)(uVar21 + 1 + lVar45) != '\0') || (*(char *)(lVar46 + 1 + uVar21) != '\0')) {
          uVar19 = (ulong)RemSP::length_;
          puVar7[uVar19] = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
LAB_00158b3f:
          *(int *)(lVar32 + uVar21 * 4) = (int)uVar19;
LAB_00158b62:
          lVar17 = (long)(int)uVar26;
          uVar26 = lVar17 + 2;
          if ((int)uVar26 < local_180) {
            if ((*(char *)(lVar45 + uVar26) != '\0') || (*(char *)(lVar46 + uVar26) != '\0')) {
LAB_00158b7f:
              lVar17 = (long)(int)uVar26;
              cVar1 = *(char *)(lVar45 + 1 + lVar17);
              *(undefined4 *)(lVar32 + lVar17 * 4) = *(undefined4 *)(lVar32 + -8 + lVar17 * 4);
              if (cVar1 == '\0') {
                do {
                  iVar27 = (int)uVar26;
                  uVar40 = iVar27 + 2;
                  if (local_180 <= (int)uVar40) {
LAB_00158d21:
                    uVar26 = (ulong)(int)uVar40;
                    if (local_180 < (int)uVar40) {
                      if ((*(char *)(lVar45 + uVar26) == '\0') &&
                         (*(char *)(lVar46 + uVar26) == '\0')) {
                        *(undefined4 *)(lVar32 + uVar26 * 4) = 0;
                        goto LAB_00158e9a;
                      }
                    }
                    else {
                      if (*(char *)(lVar45 + uVar26) != '\0') {
                        uVar21 = uVar26;
                        if (*(char *)(lVar46 + 1 + (long)iVar27) != '\0') goto LAB_00158e93;
                        goto LAB_00158db3;
                      }
                      if (*(char *)(lVar46 + uVar26) == '\0') {
                        uVar26 = (ulong)uVar40;
                        goto LAB_00158e62;
                      }
                    }
                    if (*(char *)(lVar46 + 1 + (long)iVar27) == '\0') {
                      puVar7[RemSP::length_] = RemSP::length_;
                      uVar23 = RemSP::length_ + 1;
                      *(uint *)(lVar32 + (long)(int)uVar40 * 4) = RemSP::length_;
                      RemSP::length_ = uVar23;
                    }
                    else {
                      *(undefined4 *)(lVar32 + (long)(int)uVar40 * 4) =
                           *(undefined4 *)(lVar32 + (long)iVar27 * 4);
                    }
                    goto LAB_00158e9a;
                  }
                  lVar18 = (long)iVar27;
                  lVar12 = lVar18 + 2;
                  lVar17 = lVar32 + lVar18 * 4;
                  lVar47 = lVar45 + lVar33 + 2 + lVar18;
                  lVar22 = lVar45 + 2 + lVar18;
                  lVar18 = lVar18 << 0x20;
                  lVar36 = 0;
                  while (*(char *)(lVar22 + lVar36) == '\0') {
                    if (*(char *)(lVar47 + lVar36) == '\0') {
                      uVar26 = (ulong)(uint)((int)lVar12 + (int)lVar36);
                      goto LAB_00158b19;
                    }
                    if (*(char *)(lVar22 + 1 + lVar36) != '\0') {
                      uVar21 = lVar12 + lVar36;
                      if (*(char *)(lVar36 + -1 + lVar47) == '\0') {
                        uVar19 = (ulong)RemSP::length_;
                        puVar7[uVar19] = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                      }
                      else {
                        uVar19 = (ulong)*(uint *)(lVar17 + lVar36 * 4);
                      }
                      uVar26 = uVar21 & 0xffffffff;
                      goto LAB_00158b3f;
                    }
                    if (*(char *)(lVar47 + -1 + lVar36) == '\0') {
                      puVar7[RemSP::length_] = RemSP::length_;
                      uVar40 = RemSP::length_;
                      RemSP::length_ = RemSP::length_ + 1;
                    }
                    else {
                      uVar40 = *(uint *)(lVar17 + lVar36 * 4);
                    }
                    *(uint *)(lVar17 + 8 + lVar36 * 4) = uVar40;
                    lVar18 = lVar18 + 0x200000000;
                    lVar31 = lVar12 + lVar36;
                    lVar36 = lVar36 + 2;
                    if ((long)(uVar25 & 0xffffffff) <= lVar31 + 2) {
                      uVar40 = iVar27 + (int)lVar36 + 2;
                      iVar27 = iVar27 + (int)lVar36;
                      goto LAB_00158d21;
                    }
                  }
                  if (*(char *)(lVar46 + 1 + (lVar18 >> 0x20)) != '\0') goto code_r0x00158c36;
                  lVar17 = lVar18 + 0x200000000 >> 0x20;
                  uVar26 = lVar12 + lVar36 & 0xffffffff;
LAB_00158c73:
                  cVar1 = *(char *)(lVar45 + 1 + lVar17);
                  puVar7[RemSP::length_] = RemSP::length_;
                  uVar40 = RemSP::length_ + 1;
                  *(uint *)(lVar32 + lVar17 * 4) = RemSP::length_;
                  RemSP::length_ = uVar40;
                  if (cVar1 != '\0') break;
                } while( true );
              }
              goto LAB_00158b62;
            }
            goto LAB_00158b19;
          }
          if (local_180 < (int)uVar26) {
            if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar46 + uVar26) == '\0')) {
              *(undefined4 *)(lVar32 + 8 + lVar17 * 4) = 0;
            }
            else {
              *(undefined4 *)(lVar32 + 8 + lVar17 * 4) = *(undefined4 *)(lVar32 + lVar17 * 4);
            }
          }
          else {
            if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar46 + uVar26) == '\0'))
            goto LAB_00158e62;
LAB_00158e93:
            *(undefined4 *)(lVar32 + uVar26 * 4) = *(undefined4 *)(lVar32 + -8 + uVar26 * 4);
          }
          goto LAB_00158e9a;
        }
        *(undefined4 *)(lVar32 + (long)iVar27 * 4) = 0;
        uVar26 = (ulong)(iVar27 + 2U);
      } while ((int)(iVar27 + 2U) < local_180);
    }
    uVar21 = (ulong)(int)uVar26;
    if (local_180 < (int)uVar26) {
      if ((*(char *)(lVar45 + uVar21) == '\0') && (*(char *)(lVar46 + uVar21) == '\0')) {
        *(undefined4 *)(lVar32 + uVar21 * 4) = 0;
      }
      else {
LAB_00158db3:
        puVar7[RemSP::length_] = RemSP::length_;
        uVar40 = RemSP::length_ + 1;
        *(uint *)(lVar32 + uVar21 * 4) = RemSP::length_;
        RemSP::length_ = uVar40;
      }
    }
    else {
      if ((*(char *)(lVar45 + uVar21) != '\0') || (*(char *)(lVar46 + uVar21) != '\0'))
      goto LAB_00158db3;
LAB_00158e62:
      lVar33 = (long)(int)uVar26;
      if ((*(char *)(lVar33 + 1 + lVar45) == '\0') && (*(char *)(lVar46 + 1 + lVar33) == '\0')) {
        *(undefined4 *)(lVar32 + lVar33 * 4) = 0;
      }
      else {
        puVar7[RemSP::length_] = RemSP::length_;
        uVar40 = RemSP::length_ + 1;
        *(uint *)(lVar32 + lVar33 * 4) = RemSP::length_;
        RemSP::length_ = uVar40;
      }
    }
LAB_00158e9a:
    if (2 < (int)uVar48) {
      uVar26 = 2;
      lVar46 = 1;
      lVar45 = 3;
      local_118 = 0;
      do {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar17 = *(long *)&pMVar4->field_0x10;
        lVar12 = **(long **)&pMVar4->field_0x48;
        lVar41 = lVar12 * uVar26;
        lVar33 = lVar17 + lVar41;
        lVar16 = lVar33 - lVar12;
        lVar32 = lVar33 + lVar12;
        lVar47 = *(long *)&pMVar5->field_0x10;
        lVar22 = **(long **)&pMVar5->field_0x48;
        lVar18 = lVar22 * uVar26;
        lVar36 = lVar47 + lVar18;
        lVar31 = lVar36 + lVar22 * -2;
        cVar1 = *(char *)(lVar17 + lVar41);
        if (2 < (int)uVar3) {
          lVar29 = lVar16 - lVar12;
          uVar21 = 0;
          local_140 = 0;
          if (cVar1 == '\0') goto LAB_0015903e;
LAB_00158f90:
          lVar34 = (long)(int)uVar21;
          if (*(char *)(lVar34 + 1 + lVar16) == '\0') {
            local_140 = uVar21;
            if (*(char *)(lVar33 + 1 + lVar34) != '\0') goto LAB_001590a8;
            if (*(char *)(lVar16 + lVar34) == '\0') {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar40 = RemSP::length_ + 1;
              *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
              RemSP::length_ = uVar40;
              goto LAB_00159acb;
            }
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
            goto LAB_0015a400;
          }
          *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
          uVar19 = uVar21;
LAB_0015b7d0:
          do {
            iVar27 = (int)uVar19;
            uVar40 = iVar27 + 2;
            if (local_180 <= (int)uVar40) {
LAB_0015b910:
              local_140 = (ulong)uVar40;
              if (local_180 < (int)uVar40) {
                if (*(char *)(lVar33 + local_140) == '\0') {
                  if (*(char *)(lVar32 + local_140) == '\0') goto LAB_0015b9de;
LAB_0015ba53:
                  if ((*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0') &&
                     (*(char *)(lVar33 + (ulong)(iVar27 + 1)) == '\0')) goto LAB_00159924;
                }
                else if ((*(char *)(lVar33 + (ulong)(iVar27 + 1)) == '\0') &&
                        (*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0')) {
LAB_0015bc72:
                  if (*(char *)(lVar16 + local_140) != '\0') goto LAB_00158fe2;
                  uVar10 = *(undefined4 *)(lVar31 + (long)iVar27 * 4);
                  goto LAB_0015ba6e;
                }
LAB_0015ba68:
                lVar17 = (long)iVar27;
LAB_0015ba6b:
                uVar10 = *(undefined4 *)(lVar36 + lVar17 * 4);
                goto LAB_0015ba6e;
              }
              if (*(char *)(lVar33 + local_140) == '\0') {
                if (*(char *)(lVar32 + local_140) == '\0') {
LAB_0015bc58:
                  uVar21 = local_140 & 0xffffffff;
                  goto LAB_001598fe;
                }
                if (*(char *)(lVar33 + (ulong)(iVar27 + 3)) == '\0') goto LAB_0015ba53;
                if (*(char *)(lVar33 + (ulong)(iVar27 + 1)) != '\0') goto LAB_0015ba19;
                if (*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0') goto LAB_00158f5c;
                if (*(char *)(lVar16 + (ulong)(iVar27 + 3)) == '\0') {
                  if (*(char *)(lVar16 + local_140) == '\0') goto LAB_0015ba68;
                  goto LAB_00158fe2;
                }
                uVar19 = (ulong)(int)uVar40;
LAB_0015ba24:
                if (*(char *)(lVar16 + uVar19) != '\0') {
LAB_0015ba2b:
                  uVar10 = *(undefined4 *)(lVar31 + uVar19 * 4);
LAB_0015ba34:
                  *(undefined4 *)(lVar36 + uVar19 * 4) = uVar10;
                  goto LAB_0015ba76;
                }
                uVar40 = *(uint *)(lVar31 + uVar19 * 4);
                if (*(char *)(lVar29 + uVar19) != '\0') {
                  *(uint *)(lVar36 + uVar19 * 4) = uVar40;
                  goto LAB_0015ba76;
                }
                uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
              }
              else {
                if ((*(char *)(lVar33 + (ulong)(iVar27 + 1)) != '\0') ||
                   (*(char *)(lVar32 + (ulong)(iVar27 + 1)) != '\0')) {
LAB_0015ba19:
                  uVar19 = (ulong)(int)uVar40;
                  if (*(char *)(lVar16 + 1 + uVar19) != '\0') goto LAB_0015ba24;
                  uVar10 = *(undefined4 *)(lVar36 + -8 + uVar19 * 4);
                  goto LAB_0015ba34;
                }
                if (*(char *)(lVar16 + 3 + (long)iVar27) == '\0') goto LAB_0015bc72;
                if (*(char *)(lVar16 + local_140) != '\0') goto LAB_00158fe2;
                uVar19 = (ulong)(int)uVar40;
LAB_0015b985:
                if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_0015ba2b;
                uVar40 = *(uint *)(lVar31 + -8 + uVar19 * 4);
                uVar23 = *(uint *)(lVar31 + uVar19 * 4);
              }
LAB_0015a05c:
              uVar40 = RemSP::Merge(uVar40,uVar23);
              *(uint *)(lVar36 + uVar19 * 4) = uVar40;
              goto LAB_0015ba76;
            }
            lVar13 = (long)iVar27;
            lVar34 = lVar13 + 2;
            lVar37 = lVar12 * lVar45 + lVar13;
            lVar28 = lVar12 * lVar46 + lVar13;
            lVar35 = lVar22 * local_118 + lVar13 * 4;
            lVar9 = lVar18 + lVar13 * 4;
            lVar20 = lVar13 << 0x20;
            lVar15 = lVar17 + lVar41 + lVar13;
            lVar8 = lVar17 + 2 + lVar28;
            lVar39 = lVar47 + lVar35 + 8;
            lVar44 = lVar47 + lVar9 + 8;
            lVar30 = 0;
            while( true ) {
              lVar43 = lVar20 >> 0x1e;
              lVar24 = lVar20 >> 0x20;
              if (*(char *)(lVar15 + 2 + lVar30) == '\0') goto LAB_0015ba99;
              iVar14 = (int)lVar34;
              if ((*(char *)(lVar15 + 1 + lVar30) != '\0') ||
                 (*(char *)(lVar17 + lVar37 + 1 + lVar30) != '\0')) {
                local_140 = (ulong)(uint)(iVar14 + (int)lVar30);
                goto LAB_0015ae85;
              }
              if (*(char *)(lVar8 + 1 + lVar30) == '\0') {
                local_140 = lVar34 + lVar30;
                if (*(char *)(lVar30 + 3 + lVar41 + lVar13 + lVar17) == '\0') {
                  if (*(char *)(lVar30 + 2 + lVar28 + lVar17) == '\0') {
                    *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) =
                         *(undefined4 *)(lVar31 + lVar43);
                    goto LAB_00159acb;
                  }
                  *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar39 + lVar30 * 4);
                  goto LAB_0015a400;
                }
                cVar1 = *(char *)(lVar30 + 2 + lVar28 + lVar17);
                if (*(char *)(lVar16 + 4 + lVar24) != '\0') {
                  if (cVar1 != '\0') goto LAB_001590ca;
                  uVar21 = lVar20 + 0x200000000 >> 0x20;
                  goto LAB_0015be3d;
                }
                if (cVar1 != '\0') goto LAB_0015bd52;
                *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar31 + lVar24 * 4);
                goto LAB_0015bf0b;
              }
              if (*(char *)(lVar8 + lVar30) == '\0') break;
              *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar39 + lVar30 * 4);
              lVar20 = lVar20 + 0x200000000;
              lVar43 = lVar34 + lVar30;
              lVar30 = lVar30 + 2;
              if ((long)uVar25 <= lVar43 + 2) {
                iVar27 = iVar27 + (int)lVar30;
                uVar40 = iVar14 + (int)lVar30;
                goto LAB_0015b910;
              }
            }
            uVar19 = (ulong)(uint)(iVar14 + (int)lVar30);
            lVar34 = lVar20 + 0x200000000 >> 0x20;
LAB_0015bbfa:
            if (*(char *)(lVar29 + lVar34) == '\0') {
              uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                    *(uint *)(lVar31 + lVar34 * 4));
            }
            else {
              uVar40 = *(uint *)(lVar31 + lVar34 * 4);
            }
            *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          } while( true );
        }
        if (uVar3 == 2) {
          uVar21 = 0;
          uVar40 = 0;
          if (cVar1 == '\0') {
LAB_001598e0:
            uVar40 = (uint)uVar21;
            local_140 = (ulong)(int)uVar40;
            if (*(char *)(lVar32 + local_140) == '\0') {
              uVar21 = uVar21 & 0xffffffff;
LAB_001598fe:
              uVar40 = (uint)uVar21;
              if (*(char *)(lVar33 + 1 + (long)(int)uVar40) != '\0') goto LAB_00158f5c;
LAB_00159916:
              local_140 = (ulong)(int)uVar40;
              if (*(char *)(lVar32 + 1 + local_140) == '\0') goto LAB_0015b9de;
            }
            else if (*(char *)(lVar33 + 1 + local_140) != '\0') goto LAB_00158f5c;
LAB_00159924:
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar40 = RemSP::length_ + 1;
            *(uint *)(lVar36 + local_140 * 4) = RemSP::length_;
            RemSP::length_ = uVar40;
          }
          else {
LAB_00158f5c:
            local_140 = (ulong)(int)uVar40;
            if (*(char *)(lVar16 + 1 + local_140) == '\0') goto LAB_00158fd4;
LAB_00158fe2:
            uVar10 = *(undefined4 *)(lVar31 + local_140 * 4);
LAB_0015ba6e:
            *(undefined4 *)(lVar36 + local_140 * 4) = uVar10;
          }
        }
        else {
          uVar40 = 0;
          uVar21 = 0;
          if (cVar1 != '\0') {
LAB_00158fd4:
            local_140 = (ulong)(int)uVar40;
            cVar1 = *(char *)(lVar16 + local_140);
joined_r0x0015ab63:
            if (cVar1 == '\0') goto LAB_00159924;
            goto LAB_00158fe2;
          }
LAB_0015988c:
          local_140 = (ulong)(int)uVar21;
          if (*(char *)(lVar32 + local_140) != '\0') goto LAB_00159924;
LAB_0015b9de:
          *(undefined4 *)(lVar36 + local_140 * 4) = 0;
        }
LAB_0015ba76:
        uVar26 = uVar26 + 2;
        lVar46 = lVar46 + 2;
        local_118 = local_118 + 2;
        lVar45 = lVar45 + 2;
      } while (uVar26 < uVar48);
    }
    if ((uVar2 & 0x80000001) == 1) {
      uVar26 = (ulong)(uVar2 - 1);
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar32 = *(long *)&pMVar4->field_0x10;
      lVar17 = **(long **)&pMVar4->field_0x48;
      lVar45 = lVar32 + lVar17 * uVar26;
      lVar47 = lVar45 - lVar17;
      lVar33 = *(long *)&pMVar5->field_0x10;
      lVar12 = **(long **)&pMVar5->field_0x48;
      lVar46 = lVar33 + lVar12 * uVar26;
      lVar22 = lVar46 + lVar12 * -2;
      uVar40 = 0;
      if (2 < (int)uVar3) {
        lVar31 = lVar47 - lVar17;
        lVar18 = lVar47 + 1;
        lVar16 = lVar31 + -1;
        lVar36 = lVar22 + 8;
        uVar25 = uVar25 & 0xffffffff;
        lVar34 = lVar12 * uVar26 + lVar33 + 8;
        lVar35 = (uVar26 - 1) * lVar17;
        lVar41 = lVar35 + lVar32 + 4;
        lVar29 = lVar17 * uVar26 + lVar32 + 3;
        lVar17 = lVar17 * (uVar26 - 2) + lVar32 + 3;
        lVar33 = lVar12 * (uVar26 - 2) + lVar33;
        lVar12 = lVar33 + 0x10;
        iVar27 = -2;
        uVar26 = 0;
        do {
          lVar9 = (long)(int)uVar26;
          if (*(char *)(lVar45 + lVar9) == '\0') goto LAB_0015c192;
          if (*(char *)((long)iVar27 + 3 + lVar47) != '\0') {
            *(undefined4 *)(lVar46 + lVar9 * 4) = *(undefined4 *)(lVar22 + lVar9 * 4);
            goto LAB_0015ca38;
          }
          if (*(char *)(lVar45 + 3 + (long)iVar27) != '\0') {
LAB_0015c1ac:
            uVar21 = (ulong)(int)uVar26;
            if (*(char *)(lVar47 + 2 + uVar21) != '\0') {
              if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015c1c2;
              goto LAB_0015c567;
            }
            if (*(char *)(lVar47 + uVar21) == '\0') goto LAB_0015c572;
LAB_0015c1f4:
            *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
            lVar9 = (long)(int)uVar26;
            uVar21 = lVar9 + 2;
            uVar26 = uVar21;
            if ((int)uVar21 < local_180) {
              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015c51f;
              if (*(char *)(lVar9 + 3 + lVar47) != '\0') {
                lVar15 = lVar16;
                if (*(char *)(lVar31 + uVar21) != '\0') goto LAB_0015cbc8;
                uVar40 = RemSP::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                      *(uint *)(lVar46 + lVar9 * 4));
                *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                goto LAB_0015ca38;
              }
              if (*(char *)(lVar45 + 3 + lVar9) != '\0') {
                if (*(char *)(lVar9 + 4 + lVar47) == '\0') {
                  *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = *(undefined4 *)(lVar46 + lVar9 * 4);
                  goto LAB_0015c795;
                }
                if ((*(char *)(lVar31 + 3 + lVar9) != '\0') && (*(char *)(lVar31 + uVar21) != '\0'))
                goto LAB_0015c92d;
                uVar40 = RemSP::Merge(*(uint *)(lVar22 + 0x10 + lVar9 * 4),
                                      *(uint *)(lVar46 + lVar9 * 4));
                *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
LAB_0015c597:
                do {
                  iVar27 = (int)uVar26;
                  uVar40 = iVar27 + 2;
                  if (local_180 <= (int)uVar40) {
LAB_0015cdf6:
                    if (local_180 < (int)uVar40) {
                      uVar21 = (ulong)uVar40;
                      goto LAB_0015ce02;
                    }
                    uVar21 = (ulong)(int)uVar40;
                    lVar33 = (long)iVar27;
                    if (*(char *)(lVar45 + uVar21) == '\0') {
                      if (*(char *)(lVar45 + 3 + lVar33) == '\0') goto LAB_0015d000;
                      goto LAB_0015d07c;
                    }
                    if (*(char *)(lVar47 + 3 + lVar33) != '\0') goto LAB_0015d07c;
LAB_0015ceb6:
                    uVar10 = *(undefined4 *)(lVar46 + lVar33 * 4);
                    goto LAB_0015d080;
                  }
                  lVar30 = (long)iVar27;
                  lVar13 = lVar30 << 0x20;
                  lVar9 = lVar34 + lVar30 * 4;
                  lVar15 = lVar41 + lVar30;
                  lVar8 = lVar12 + lVar30 * 4;
                  lVar44 = 0;
LAB_0015c600:
                  if (*(char *)(lVar29 + lVar30 + -1 + lVar44) != '\0') {
                    iVar42 = (int)lVar44;
                    iVar14 = (int)(lVar30 + 2);
                    if (*(char *)(lVar15 + -1 + lVar44) != '\0') {
                      uVar26 = (ulong)(uint)(iVar14 + iVar42);
                      *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar8 + -8 + lVar44 * 4)
                      ;
                      goto LAB_0015ca38;
                    }
                    if (*(char *)(lVar29 + lVar30 + lVar44) != '\0') goto code_r0x0015c623;
                    uVar40 = iVar14 + iVar42;
                    *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar46 + (lVar13 >> 0x1e))
                    ;
LAB_0015c8ae:
                    uVar26 = (ulong)uVar40;
                    goto LAB_0015c8bd;
                  }
                  uVar26 = lVar30 + 2 + lVar44;
                  iVar27 = (int)uVar26;
                  lVar9 = lVar13 + 0x300000000 >> 0x20;
                  uVar21 = lVar30 + 2 + lVar44;
                  if (*(char *)(lVar45 + lVar9) == '\0') goto LAB_0015c33f;
                  if (*(char *)(lVar47 + lVar9) != '\0') {
LAB_0015c535:
                    do {
                      *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
                      uVar21 = (long)(int)uVar26 + 2;
                      if (local_180 <= (int)uVar21) {
                        if (local_180 < (int)uVar21) goto LAB_0015ce02;
                        if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015cec2;
LAB_0015ce6e:
                        if (*(char *)(lVar47 + 1 + uVar21) == '\0') {
                          uVar10 = *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
                          goto LAB_0015cede;
                        }
                        if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015ceda;
                        uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                        if (*(char *)(lVar31 + uVar21) == '\0') {
                          uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
LAB_0015d42e:
                          uVar40 = RemSP::Merge(uVar40,uVar23);
LAB_0015d43a:
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                        }
                        else {
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                        }
                        goto LAB_0015d084;
                      }
                      uVar26 = uVar21;
                      if (*(char *)(lVar45 + uVar21) != '\0') goto LAB_0015cb0d;
LAB_0015c192:
                      iVar27 = (int)uVar26;
                      uVar21 = (ulong)iVar27;
                      if (*(char *)(uVar21 + 1 + lVar45) == '\0') {
                        while( true ) {
                          uVar21 = (ulong)iVar27;
LAB_0015c33f:
                          *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
                          lVar9 = (long)iVar27;
                          uVar21 = lVar9 + 2;
                          if (local_180 <= (int)uVar21) break;
                          uVar26 = uVar21;
                          if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015c192;
                          if (*(char *)(lVar9 + 3 + lVar47) != '\0') {
                            if ((*(char *)(lVar47 + uVar21) == '\0') &&
                               (lVar15 = lVar31, *(char *)(lVar18 + lVar9) != '\0'))
                            goto LAB_0015cbc8;
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                 *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                            goto LAB_0015ca38;
                          }
                          if (*(char *)(lVar45 + 3 + lVar9) == '\0') {
                            if (*(char *)(lVar47 + uVar21) == '\0') {
                              if (*(char *)(lVar18 + lVar9) == '\0') {
                                RemSP::P_[RemSP::length_] = RemSP::length_;
                                uVar40 = RemSP::length_ + 1;
                                *(uint *)(lVar46 + 8 + lVar9 * 4) = RemSP::length_;
                                RemSP::length_ = uVar40;
                                goto LAB_0015c8bd;
                              }
                              uVar10 = *(undefined4 *)(lVar22 + lVar9 * 4);
                            }
                            else {
                              uVar10 = *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                            }
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = uVar10;
                            goto LAB_0015c8bd;
                          }
                          cVar1 = *(char *)(lVar9 + 2 + lVar47);
                          if (*(char *)(lVar9 + 4 + lVar47) != '\0') {
                            if (cVar1 != '\0') goto LAB_0015c1c2;
                            if (*(char *)(lVar18 + lVar9) == '\0') {
                              *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                   *(undefined4 *)(lVar22 + 0x10 + lVar9 * 4);
                            }
                            else {
LAB_0015cc99:
                              if ((*(char *)(lVar31 + 1 + uVar21) == '\0') ||
                                 (*(char *)(lVar31 + uVar21) == '\0')) {
                                uVar40 = RemSP::Merge(*(uint *)(lVar22 + -8 + uVar21 * 4),
                                                      *(uint *)(lVar22 + 8 + uVar21 * 4));
                              }
                              else {
                                uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                              }
                              *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                            }
                            goto LAB_0015c597;
                          }
                          if (cVar1 != '\0') goto LAB_0015c1f4;
                          if (*(char *)(lVar18 + lVar9) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar40 = RemSP::length_;
                            RemSP::length_ = RemSP::length_ + 1;
                          }
                          else {
                            uVar40 = *(uint *)(lVar22 + lVar9 * 4);
                          }
LAB_0015c458:
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                          lVar9 = (long)(int)uVar26;
                          uVar26 = lVar9 + 2;
                          if (local_180 <= (int)uVar26) {
                            uVar21 = uVar26;
                            if (local_180 < (int)uVar26) goto LAB_0015ce02;
                            if (*(char *)(lVar45 + uVar26) == '\0') goto LAB_0015cfcb;
                            if (*(char *)(lVar47 + 3 + lVar9) == '\0') goto LAB_0015d40b;
                            uVar40 = RemSP::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                                  *(uint *)(lVar46 + lVar9 * 4));
                            goto LAB_0015d40f;
                          }
                          if (*(char *)(lVar45 + uVar26) != '\0') {
                            if (*(char *)(lVar9 + 3 + lVar47) == '\0') {
                              if (*(char *)(lVar45 + 3 + lVar9) == '\0') {
                                *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                     *(undefined4 *)(lVar46 + lVar9 * 4);
                                goto LAB_0015c8bd;
                              }
                              if (*(char *)(lVar9 + 4 + lVar47) == '\0') {
                                *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                     *(undefined4 *)(lVar46 + lVar9 * 4);
                                goto LAB_0015c795;
                              }
                              uVar40 = RemSP::Merge(*(uint *)(lVar22 + 0x10 + lVar9 * 4),
                                                    *(uint *)(lVar46 + lVar9 * 4));
                              *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                              goto LAB_0015c597;
                            }
                            uVar40 = RemSP::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                                  *(uint *)(lVar46 + lVar9 * 4));
                            *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
LAB_0015ca38:
                            while( true ) {
                              iVar27 = (int)uVar26;
                              iVar14 = iVar27 + 2;
                              if (local_180 <= iVar14) break;
                              lVar20 = (long)iVar27;
                              lVar9 = lVar20 + 2;
                              lVar44 = lVar33 + 8 + lVar20 * 4;
                              lVar15 = lVar32 + lVar35 + 2 + lVar20;
                              lVar8 = lVar29 + lVar20;
                              lVar30 = lVar34 + lVar20 * 4;
                              lVar20 = lVar20 << 0x20;
                              lVar13 = 0;
LAB_0015ca96:
                              lVar20 = lVar20 + 0x200000000;
                              iVar14 = (int)lVar9;
                              iVar42 = (int)lVar13;
                              if (*(char *)(lVar8 + -1 + lVar13) == '\0') {
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
                                goto LAB_0015c192;
                              }
                              if (*(char *)(lVar8 + -2 + lVar13) == '\0') {
                                if (*(char *)(lVar15 + 1 + lVar13) == '\0') {
                                  uVar21 = lVar9 + lVar13;
                                  if (*(char *)(lVar13 + lVar8) == '\0') {
                                    if (*(char *)(lVar13 + lVar15) == '\0') {
                                      uVar10 = *(undefined4 *)(lVar44 + -8 + lVar13 * 4);
                                    }
                                    else {
                                      uVar10 = *(undefined4 *)(lVar44 + lVar13 * 4);
                                    }
                                    *(undefined4 *)(lVar30 + lVar13 * 4) = uVar10;
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_0015c8bd;
                                  }
                                  if (*(char *)(lVar13 + 2 + lVar15) == '\0') {
                                    if (*(char *)(lVar13 + lVar15) == '\0') {
                                      uVar26 = uVar21 & 0xffffffff;
                                      uVar40 = *(uint *)(lVar44 + -8 + lVar13 * 4);
                                      goto LAB_0015c458;
                                    }
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_0015c1f4;
                                  }
                                  if (*(char *)(lVar13 + lVar15) != '\0') {
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_0015c1c2;
                                  }
                                  uVar26 = uVar21 & 0xffffffff;
                                  uVar21 = lVar20 >> 0x20;
                                  goto LAB_0015cc99;
                                }
                                if (*(char *)(lVar15 + lVar13) != '\0') goto code_r0x0015cabb;
                                lVar15 = lVar31;
                                uVar21 = lVar20 >> 0x20;
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
LAB_0015cbc8:
                                if (*(char *)(lVar15 + uVar21) == '\0') {
                                  uVar40 = *(uint *)(lVar22 + -8 + uVar21 * 4);
                                  uVar23 = *(uint *)(lVar22 + uVar21 * 4);
LAB_0015cc07:
                                  uVar40 = RemSP::Merge(uVar40,uVar23);
                                }
                                else {
LAB_0015cbce:
                                  uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                }
                                *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                              }
                              else {
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
LAB_0015cb0d:
                                uVar21 = (ulong)(int)uVar26;
                                if (*(char *)(uVar21 + 1 + lVar47) == '\0') {
                                  if (*(char *)(lVar45 + 1 + uVar21) == '\0') {
                                    *(undefined4 *)(lVar46 + uVar21 * 4) =
                                         *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
                                    goto LAB_0015c8bd;
                                  }
                                  if (*(char *)(uVar21 + 2 + lVar47) != '\0') {
                                    if (*(char *)(lVar31 + 1 + uVar21) == '\0') {
                                      uVar40 = RemSP::Merge(*(uint *)(lVar22 + 8 + uVar21 * 4),
                                                            *(uint *)(lVar46 + -8 + uVar21 * 4));
LAB_0015cc89:
                                      *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                    }
                                    else {
                                      if (*(char *)(lVar47 + uVar21) != '\0') {
                                        uVar40 = *(uint *)(lVar22 + 8 + uVar21 * 4);
                                        goto LAB_0015cc89;
                                      }
                                      cVar1 = *(char *)(lVar31 + uVar21);
                                      uVar40 = *(uint *)(lVar22 + 8 + uVar21 * 4);
LAB_0015cd08:
                                      if (cVar1 == '\0') {
                                        uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
                                        goto LAB_0015c279;
                                      }
                                      *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                    }
                                    goto LAB_0015c597;
                                  }
                                  *(undefined4 *)(lVar46 + uVar21 * 4) =
                                       *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
LAB_0015c795:
                                  iVar27 = (int)uVar26;
                                  uVar40 = iVar27 + 2;
                                  if (local_180 <= (int)uVar40) {
LAB_0015cd69:
                                    uVar21 = (ulong)uVar40;
                                    if (local_180 < (int)uVar40) goto LAB_0015ce02;
                                    uVar21 = (ulong)(int)uVar40;
                                    uVar26 = (ulong)uVar40;
                                    if (*(char *)(lVar45 + uVar21) != '\0') {
                                      lVar45 = (long)iVar27;
                                      if (*(char *)(lVar47 + 3 + lVar45) == '\0') {
                                        uVar40 = *(uint *)(lVar46 + lVar45 * 4);
                                        goto LAB_0015d43a;
                                      }
                                      if ((*(char *)(lVar31 + uVar21) == '\0') ||
                                         (*(char *)(lVar47 + lVar45) == '\0')) {
                                        uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                        uVar23 = *(uint *)(lVar46 + lVar45 * 4);
                                        goto LAB_0015d42e;
                                      }
                                      goto LAB_0015cdb9;
                                    }
                                    goto LAB_0015cfcb;
                                  }
                                  lVar30 = (long)iVar27;
                                  lVar9 = lVar30 + 2;
                                  lVar44 = lVar30 << 0x20;
                                  lVar15 = lVar34 + lVar30 * 4;
                                  lVar8 = lVar41 + lVar30;
                                  lVar13 = 0;
                                  while( true ) {
                                    if (*(char *)(lVar29 + lVar30 + -1 + lVar13) == '\0') {
                                      uVar26 = (ulong)(uint)((int)lVar9 + (int)lVar13);
                                      goto LAB_0015c51f;
                                    }
                                    lVar28 = lVar44 >> 0x1e;
                                    lVar20 = lVar44 >> 0x20;
                                    if (*(char *)(lVar8 + -1 + lVar13) != '\0') break;
                                    if (*(char *)(lVar29 + lVar30 + lVar13) == '\0') {
                                      uVar40 = (int)lVar9 + (int)lVar13;
                                      *(undefined4 *)(lVar15 + lVar13 * 4) =
                                           *(undefined4 *)(lVar46 + lVar28);
                                      goto LAB_0015c8ae;
                                    }
                                    if (*(char *)(lVar8 + lVar13) != '\0') {
                                      if (*(char *)(lVar13 + lVar17 + lVar30) == '\0') {
                                        uVar40 = RemSP::Merge(*(uint *)(lVar12 + lVar30 * 4 +
                                                                       lVar13 * 4),
                                                              *(uint *)(lVar46 + lVar28));
                                        *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                      }
                                      else {
                                        if (*(char *)(lVar13 + -1 + lVar17 + lVar30) == '\0') {
                                          uVar40 = *(uint *)(lVar12 + lVar30 * 4 + lVar13 * 4);
                                          uVar23 = *(uint *)(lVar46 + lVar28);
                                        }
                                        else {
                                          if (*(char *)(lVar47 + lVar20) != '\0') {
                                            uVar21 = lVar44 + 0x200000000 >> 0x20;
                                            uVar26 = lVar9 + lVar13 & 0xffffffff;
LAB_0015c92d:
                                            cVar1 = *(char *)(lVar16 + uVar21);
                                            uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                                            goto LAB_0015cd08;
                                          }
                                          uVar40 = *(uint *)(lVar12 + lVar30 * 4 + lVar13 * 4);
                                          uVar23 = *(uint *)(lVar46 + lVar20 * 4);
                                        }
                                        uVar40 = RemSP::Merge(uVar40,uVar23);
                                        *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                      }
                                      uVar26 = lVar9 + lVar13 & 0xffffffff;
                                      goto LAB_0015c597;
                                    }
                                    *(undefined4 *)(lVar15 + lVar13 * 4) =
                                         *(undefined4 *)(lVar15 + -8 + lVar13 * 4);
                                    lVar44 = lVar44 + 0x200000000;
                                    lVar20 = lVar13 + lVar9;
                                    lVar13 = lVar13 + 2;
                                    if ((long)uVar25 <= lVar20 + 2) {
                                      uVar40 = iVar27 + (int)lVar13 + 2;
                                      iVar27 = iVar27 + (int)lVar13;
                                      goto LAB_0015cd69;
                                    }
                                  }
                                  if (*(char *)(lVar13 + -1 + lVar17 + lVar30) != '\0') {
                                    if (*(char *)(lVar47 + lVar20) == '\0') {
                                      uVar40 = *(uint *)(lVar12 + lVar30 * 4 + -8 + lVar13 * 4);
                                      uVar23 = *(uint *)(lVar46 + lVar20 * 4);
                                      goto LAB_0015c9b0;
                                    }
                                    lVar15 = lVar16;
                                    uVar21 = lVar44 + 0x200000000 >> 0x20;
                                    uVar26 = lVar9 + lVar13 & 0xffffffff;
                                    goto LAB_0015cbc8;
                                  }
                                  uVar40 = *(uint *)(lVar12 + lVar30 * 4 + -8 + lVar13 * 4);
                                  uVar23 = *(uint *)(lVar46 + lVar28);
LAB_0015c9b0:
                                  uVar40 = RemSP::Merge(uVar40,uVar23);
                                  *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                  uVar26 = lVar9 + lVar13 & 0xffffffff;
                                }
                                else {
                                  if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015cbce;
                                  uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                  if (*(char *)(lVar31 + uVar21) == '\0') {
                                    uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
                                    goto LAB_0015cc07;
                                  }
                                  *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                }
                              }
                            }
LAB_0015ce34:
                            uVar21 = (ulong)iVar14;
                            if (local_180 < iVar14) {
                              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015d000;
                              lVar33 = (long)iVar27;
                              if (*(char *)(lVar45 + 1 + lVar33) != '\0') goto LAB_0015ceb6;
                            }
                            else {
                              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015cec2;
                              if (*(char *)(lVar45 + 1 + (long)iVar27) != '\0') goto LAB_0015ce6e;
                              if (*(char *)(lVar47 + 3 + (long)iVar27) != '\0') {
                                if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015d07c;
                                goto LAB_0015d053;
                              }
                            }
                            if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015d07c;
                            uVar10 = *(undefined4 *)(lVar22 + (long)iVar27 * 4);
                            goto LAB_0015d080;
                          }
LAB_0015c51f:
                          iVar27 = (int)uVar26;
                          uVar21 = (ulong)iVar27;
                          if (*(char *)(uVar21 + 1 + lVar45) != '\0') {
                            if (*(char *)(lVar47 + 1 + uVar21) != '\0') goto LAB_0015c535;
                            uVar21 = (ulong)iVar27;
                            if (*(char *)(uVar21 + 2 + lVar47) != '\0') goto LAB_0015c567;
LAB_0015c572:
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar40 = RemSP::length_;
                            RemSP::length_ = RemSP::length_ + 1;
                            goto LAB_0015c458;
                          }
                        }
                        if (local_180 < (int)uVar21) {
                          if (*(char *)(lVar45 + uVar21) == '\0') {
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = 0;
                            goto LAB_0015d084;
                          }
LAB_0015d3c7:
                          if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015d3cf;
                          if (*(char *)(lVar47 + 1 + lVar9) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar40 = RemSP::length_ + 1;
                            *(uint *)(lVar46 + 8 + lVar9 * 4) = RemSP::length_;
                            RemSP::length_ = uVar40;
                            goto LAB_0015d084;
                          }
                          uVar10 = *(undefined4 *)(lVar22 + lVar9 * 4);
                        }
                        else {
                          if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_0015cec2;
                          if (*(char *)(lVar47 + 3 + lVar9) == '\0') goto LAB_0015d3c7;
                          if ((*(char *)(lVar47 + uVar21) == '\0') &&
                             (*(char *)(lVar47 + 1 + lVar9) != '\0')) {
LAB_0015d053:
                            if (*(char *)(lVar31 + uVar21) != '\0') goto LAB_0015ceda;
                            uVar40 = *(uint *)(lVar22 + -8 + uVar21 * 4);
                            uVar23 = *(uint *)(lVar22 + uVar21 * 4);
                            goto LAB_0015d42e;
                          }
LAB_0015d3cf:
                          uVar10 = *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                        }
                        *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = uVar10;
                        goto LAB_0015d084;
                      }
                    } while (*(char *)(lVar47 + 1 + uVar21) != '\0');
                    goto LAB_0015c1ac;
                  }
                  if (*(char *)(lVar47 + 4 + (lVar13 >> 0x20)) == '\0') goto LAB_0015c1f4;
LAB_0015c1c2:
                  uVar21 = (ulong)(int)uVar26;
                  if (*(char *)(lVar31 + 1 + uVar21) == '\0') {
                    uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                    uVar23 = *(uint *)(lVar22 + 8 + uVar21 * 4);
LAB_0015c279:
                    uVar40 = RemSP::Merge(uVar40,uVar23);
                  }
                  else {
                    uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                  }
                  *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                } while( true );
              }
              *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = *(undefined4 *)(lVar46 + lVar9 * 4);
              goto LAB_0015c8bd;
            }
            if (local_180 < (int)uVar21) {
LAB_0015ce02:
              uVar21 = (ulong)(int)uVar21;
              if (*(char *)(lVar45 + uVar21) != '\0') {
                uVar10 = *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
LAB_0015d080:
                *(undefined4 *)(lVar46 + uVar21 * 4) = uVar10;
                goto LAB_0015d084;
              }
            }
            else {
              if (*(char *)(lVar45 + uVar21) != '\0') {
                if (*(char *)(lVar47 + 3 + lVar9) == '\0') {
LAB_0015d40b:
                  uVar40 = *(uint *)(lVar46 + lVar9 * 4);
LAB_0015d40f:
                  *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                }
                else if (*(char *)(lVar31 + uVar21) == '\0') {
                  uVar40 = RemSP::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                        *(uint *)(lVar46 + lVar9 * 4));
                  *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                }
                else {
LAB_0015cdb9:
                  if (*(char *)(lVar31 + -1 + uVar21) == '\0') {
                    uVar40 = RemSP::Merge(*(uint *)(lVar22 + -8 + uVar21 * 4),
                                          *(uint *)(lVar22 + uVar21 * 4));
                    *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                  }
                  else {
                    *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
                  }
                }
                goto LAB_0015d084;
              }
LAB_0015cfcb:
              uVar21 = (ulong)(int)uVar26;
              if (*(char *)(uVar21 + 1 + lVar45) != '\0') {
                if (*(char *)(lVar47 + 1 + uVar21) != '\0') {
LAB_0015d07c:
                  uVar10 = *(undefined4 *)(lVar22 + uVar21 * 4);
                  goto LAB_0015d080;
                }
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar40 = RemSP::length_ + 1;
                *(uint *)(lVar46 + uVar21 * 4) = RemSP::length_;
                RemSP::length_ = uVar40;
                goto LAB_0015d084;
              }
            }
LAB_0015d000:
            *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
            goto LAB_0015d084;
          }
          if (*(char *)(lVar47 + lVar9) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar40 = RemSP::length_ + 1;
            *(uint *)(lVar46 + lVar9 * 4) = RemSP::length_;
            RemSP::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar46 + lVar9 * 4) = *(undefined4 *)(lVar22 + lVar9 * 4);
          }
LAB_0015c8bd:
          iVar27 = (int)uVar26;
          uVar40 = iVar27 + 2;
          uVar26 = (ulong)uVar40;
        } while ((int)uVar40 < local_180);
      }
      uVar21 = (ulong)(int)uVar40;
      if (local_180 < (int)uVar40) {
        if (*(char *)(lVar45 + uVar21) == '\0') {
LAB_0015cee7:
          *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
        }
        else {
LAB_0015ced2:
          if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_0015ceda;
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar40 = RemSP::length_ + 1;
          *(uint *)(lVar46 + uVar21 * 4) = RemSP::length_;
          RemSP::length_ = uVar40;
        }
      }
      else {
        if (*(char *)(lVar45 + uVar21) == '\0') {
LAB_0015cec2:
          if (*(char *)(lVar45 + 1 + uVar21) == '\0') goto LAB_0015cee7;
        }
        if (*(char *)(lVar47 + 1 + uVar21) == '\0') goto LAB_0015ced2;
LAB_0015ceda:
        uVar10 = *(undefined4 *)(lVar22 + uVar21 * 4);
LAB_0015cede:
        *(undefined4 *)(lVar46 + uVar21 * 4) = uVar10;
      }
    }
  }
LAB_0015d084:
  puVar7 = RemSP::P_;
  uVar40 = 1;
  if (1 < RemSP::length_) {
    uVar40 = 1;
    uVar25 = 1;
    do {
      if (puVar7[uVar25] < uVar25) {
        uVar23 = puVar7[puVar7[uVar25]];
      }
      else {
        uVar23 = uVar40;
        uVar40 = uVar40 + 1;
      }
      puVar7[uVar25] = uVar23;
      uVar25 = uVar25 + 1;
    } while (uVar25 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar40;
  puVar7 = RemSP::P_;
  uVar25 = 0;
  iVar27 = (int)(uVar11 & 0xfffffffffffffffe);
  if (0 < (int)uVar48) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar32 = *(long *)&pMVar4->field_0x10;
    lVar17 = **(long **)&pMVar4->field_0x48;
    lVar12 = *(long *)&pMVar5->field_0x10;
    lVar47 = **(long **)&pMVar5->field_0x48;
    lVar33 = lVar12 + lVar47;
    lVar46 = lVar32 + 1 + lVar17;
    lVar45 = lVar32 + 1;
    uVar25 = 0;
    lVar22 = lVar12;
    do {
      puVar6 = RemSP::P_;
      lVar36 = lVar47 * uVar25 + lVar12;
      lVar18 = lVar36 + lVar47;
      if (iVar27 < 1) {
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        do {
          lVar31 = (long)*(int *)(lVar22 + uVar26 * 4);
          if (lVar31 < 1) {
            *(undefined8 *)(lVar22 + uVar26 * 4) = 0;
            uVar21 = uVar26 + 1;
            *(undefined4 *)(lVar33 + uVar26 * 4) = 0;
            uVar40 = 0;
          }
          else {
            uVar40 = puVar6[lVar31];
            uVar23 = uVar40;
            if (*(char *)(lVar45 + -1 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar22 + uVar26 * 4) = uVar23;
            uVar21 = uVar26 | 1;
            uVar23 = uVar40;
            if (*(char *)(lVar45 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar22 + 4 + uVar26 * 4) = uVar23;
            uVar23 = uVar40;
            if (*(char *)(lVar46 + -1 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar33 + uVar26 * 4) = uVar23;
            if (*(char *)(lVar46 + uVar26) == '\0') {
              uVar40 = 0;
            }
          }
          *(uint *)(lVar18 + uVar21 * 4) = uVar40;
          uVar26 = uVar26 + 2;
        } while ((long)uVar26 < (long)(uVar11 & 0xfffffffffffffffe));
      }
      if ((uVar3 & 0x80000001) == 1) {
        lVar31 = (long)*(int *)(lVar36 + uVar26 * 4);
        if (lVar31 < 1) {
          *(undefined4 *)(lVar36 + uVar26 * 4) = 0;
          *(undefined4 *)(lVar18 + uVar26 * 4) = 0;
        }
        else {
          lVar16 = lVar17 * uVar25 + lVar32;
          uVar40 = puVar7[lVar31];
          uVar23 = uVar40;
          if (*(char *)(lVar16 + uVar26) == '\0') {
            uVar23 = 0;
          }
          *(uint *)(lVar36 + uVar26 * 4) = uVar23;
          if (*(char *)(lVar16 + lVar17 + uVar26) == '\0') {
            *(undefined4 *)(lVar18 + uVar26 * 4) = 0;
          }
          else {
            *(uint *)(lVar18 + uVar26 * 4) = uVar40;
          }
        }
      }
      uVar25 = uVar25 + 2;
      lVar33 = lVar33 + lVar47 * 2;
      lVar46 = lVar46 + lVar17 * 2;
      lVar45 = lVar45 + lVar17 * 2;
      lVar22 = lVar22 + lVar47 * 2;
    } while (uVar25 < uVar48);
    uVar25 = uVar25 & 0xffffffff;
  }
  puVar7 = RemSP::P_;
  if ((uVar2 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar45 = *(long *)&pMVar4->field_0x10;
    lVar32 = **(long **)&pMVar4->field_0x48 * uVar25;
    lVar46 = *(long *)&pMVar5->field_0x10;
    lVar33 = uVar25 * **(long **)&pMVar5->field_0x48;
    if (iVar27 < 1) {
      uVar25 = 0;
    }
    else {
      lVar17 = lVar32 + lVar45;
      lVar12 = lVar33 + lVar46;
      uVar25 = 0;
      do {
        lVar47 = (long)*(int *)(lVar12 + uVar25 * 4);
        if (lVar47 < 1) {
          *(undefined8 *)(lVar12 + uVar25 * 4) = 0;
        }
        else {
          uVar2 = puVar7[lVar47];
          uVar48 = uVar2;
          if (*(char *)(lVar17 + uVar25) == '\0') {
            uVar48 = 0;
          }
          *(uint *)(lVar12 + uVar25 * 4) = uVar48;
          if (*(char *)(lVar17 + 1 + uVar25) == '\0') {
            *(undefined4 *)(lVar12 + 4 + uVar25 * 4) = 0;
          }
          else {
            *(uint *)(lVar12 + 4 + uVar25 * 4) = uVar2;
          }
        }
        uVar25 = uVar25 + 2;
      } while (uVar25 < (uVar11 & 0xfffffffe));
    }
    puVar7 = RemSP::P_;
    if ((uVar3 & 0x80000001) == 1) {
      lVar46 = lVar46 + lVar33;
      lVar33 = (long)*(int *)(lVar46 + uVar25 * 4);
      if ((0 < lVar33) && (*(char *)(lVar45 + lVar32 + uVar25) != '\0')) {
        *(uint *)(lVar46 + uVar25 * 4) = RemSP::P_[lVar33];
        goto LAB_0015d374;
      }
      *(undefined4 *)(lVar46 + uVar25 * 4) = 0;
    }
  }
  puVar7 = RemSP::P_;
  if (RemSP::P_ == (uint *)0x0) {
    return;
  }
LAB_0015d374:
  operator_delete__(puVar7);
  return;
code_r0x00158c36:
  uVar26 = lVar12 + lVar36 & 0xffffffff;
  goto LAB_00158b7f;
LAB_0015ba99:
  local_140 = lVar34 + lVar30;
  if (*(char *)(lVar30 + 2 + lVar37 + lVar17) == '\0') goto LAB_0015907b;
  lVar15 = lVar20 + 0x300000000 >> 0x20;
  lVar8 = lVar20 + 0x100000000 >> 0x20;
  if (*(char *)(lVar33 + lVar15) == '\0') {
    if (*(char *)(lVar32 + lVar8) != '\0') {
      *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar43);
      goto LAB_00159dd5;
    }
    if (*(char *)(lVar33 + lVar8) != '\0') {
      *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar43);
      goto LAB_00159dd5;
    }
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar40 = RemSP::length_ + 1;
    *(uint *)(lVar9 + lVar47 + 8 + lVar30 * 4) = RemSP::length_;
    RemSP::length_ = uVar40;
    goto LAB_00159dd5;
  }
  uVar19 = local_140;
  if (*(char *)(lVar33 + lVar8) != '\0') {
    uVar21 = lVar20 + 0x200000000 >> 0x20;
    goto LAB_0015bb2b;
  }
  if (*(char *)(lVar32 + lVar8) == '\0') goto LAB_0015908d;
  if (*(char *)(lVar16 + lVar15) != '\0') goto LAB_0015bb3a;
  if (*(char *)(lVar16 + 4 + lVar24) != '\0') {
    uVar21 = lVar20 + 0x200000000 >> 0x20;
    goto LAB_0015aed4;
  }
  if (*(char *)(lVar30 + 2 + lVar28 + lVar17) != '\0') {
LAB_0015bd52:
    local_140 = lVar34 + lVar30;
    *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4);
    goto LAB_001590f7;
  }
  *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar24 * 4);
LAB_0015bf0b:
  local_140 = lVar34 + lVar30;
LAB_0015a549:
  lVar34 = (long)(int)local_140;
  uVar19 = lVar34 + 2;
  iVar27 = (int)uVar19;
  if (iVar27 < local_180) {
    if (*(char *)(lVar33 + uVar19) == '\0') {
      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_0015a689;
      if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_0015a74e;
      if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
        goto LAB_0015adf3;
      }
    }
    else {
      if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
        goto LAB_0015b7d0;
      }
      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
        *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
        goto LAB_0015af31;
      }
    }
    if (*(char *)(lVar34 + 4 + lVar16) != '\0') {
      uVar40 = RemSP::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
      *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
      local_140 = uVar19 & 0xffffffff;
      goto LAB_001591fa;
    }
    *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
    local_140 = uVar19 & 0xffffffff;
LAB_0015a7c2:
    iVar14 = (int)local_140;
    uVar40 = iVar14 + 2;
    if ((int)uVar40 < local_180) {
      lVar9 = (long)iVar14;
      lVar34 = lVar9 + 2;
      lVar20 = lVar9 << 0x20;
      lVar35 = lVar18 + lVar9 * 4;
      lVar30 = lVar47 + lVar35 + 8;
      lVar15 = lVar41 + lVar9 + lVar17;
      lVar8 = lVar15 + 3;
      lVar13 = lVar12 * lVar46 + lVar9 + lVar17;
      lVar44 = 0;
LAB_0015a84a:
      iVar27 = (int)lVar34;
      lVar37 = lVar20 >> 0x1e;
      iVar42 = (int)lVar44;
      lVar28 = lVar20 >> 0x20;
      if (*(char *)(lVar15 + 2 + lVar44) == '\0') {
        if (*(char *)(lVar12 * lVar45 + lVar9 + lVar17 + 2 + lVar44) == '\0') {
          uVar19 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_0015a689;
        }
        if (*(char *)(lVar8 + lVar44) == '\0') {
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar44 * 4) = *(undefined4 *)(lVar36 + lVar37);
          local_140 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_00159dd5;
        }
        if (*(char *)(lVar13 + 3 + lVar44) != '\0') {
          uVar19 = lVar34 + lVar44;
          if (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0') {
            uVar40 = RemSP::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4
                                           ),*(uint *)(lVar36 + lVar37));
          }
          else {
            if (*(char *)(lVar16 + lVar28) != '\0') {
              uVar21 = lVar20 + 0x200000000 >> 0x20;
              goto LAB_0015abcc;
            }
            uVar40 = RemSP::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4
                                           ),*(uint *)(lVar36 + lVar28 * 4));
          }
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          goto LAB_0015adf3;
        }
      }
      else {
        if (*(char *)(lVar13 + 3 + lVar44) != '\0') {
          uVar19 = lVar34 + lVar44;
          if (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0') {
            uVar40 = RemSP::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4
                                           ),*(uint *)(lVar36 + lVar37));
          }
          else {
            if (*(char *)(lVar16 + lVar28) != '\0') {
              uVar21 = lVar20 + 0x200000000 >> 0x20;
LAB_00159132:
              uVar40 = *(uint *)(lVar31 + uVar21 * 4);
              if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                *(uint *)(lVar36 + uVar21 * 4) = uVar40;
              }
              else {
                *(uint *)(lVar36 + uVar21 * 4) = uVar40;
              }
              goto LAB_0015b7d0;
            }
            uVar40 = RemSP::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4
                                           ),*(uint *)(lVar36 + lVar28 * 4));
          }
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          goto LAB_0015b7d0;
        }
        if (*(char *)(lVar8 + lVar44) == '\0') {
          iVar27 = iVar27 + iVar42;
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar44 * 4) = *(undefined4 *)(lVar36 + lVar37);
          goto LAB_0015af31;
        }
      }
      if (*(char *)(lVar13 + 4 + lVar44) != '\0') {
        if (((*(char *)(lVar29 + 3 + lVar28) == '\0') ||
            (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0')) ||
           (*(char *)(lVar16 + lVar28) == '\0')) {
          uVar40 = RemSP::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 0x10 +
                                         lVar44 * 4),*(uint *)(lVar36 + lVar28 * 4));
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          local_140 = lVar34 + lVar44 & 0xffffffff;
          goto LAB_001591fa;
        }
        uVar19 = lVar20 + 0x200000000 >> 0x20;
        local_140 = lVar34 + lVar44;
LAB_0015a9a9:
        local_140 = local_140 & 0xffffffff;
        uVar40 = *(uint *)(lVar31 + 8 + uVar19 * 4);
        if (*(char *)(lVar29 + -1 + uVar19) == '\0') {
          uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar19 * 4));
          *(uint *)(lVar36 + uVar19 * 4) = uVar40;
        }
        else {
          *(uint *)(lVar36 + uVar19 * 4) = uVar40;
        }
LAB_001591fa:
        iVar14 = (int)local_140;
        uVar40 = iVar14 + 2;
        if (local_180 <= (int)uVar40) {
LAB_0015941b:
          local_140 = (ulong)uVar40;
          if (local_180 < (int)uVar40) goto LAB_0015ae28;
          if (*(char *)(lVar33 + local_140) == '\0') {
            lVar17 = (long)iVar14;
            cVar1 = *(char *)(lVar33 + 3 + lVar17);
            if (*(char *)(lVar32 + local_140) == '\0') {
              if (cVar1 == '\0') goto LAB_00159916;
              uVar10 = *(undefined4 *)(lVar31 + local_140 * 4);
              goto LAB_0015ba6e;
            }
            if (cVar1 == '\0') goto LAB_0015ba6b;
          }
          lVar17 = (long)iVar14;
          if (*(char *)(lVar16 + 3 + lVar17) == '\0') goto LAB_0015ba6b;
          goto LAB_00158fe2;
        }
        lVar13 = (long)iVar14;
        lVar20 = lVar13 << 0x20;
        lVar9 = lVar17 + 3 + lVar41 + lVar13;
        lVar8 = lVar12 * lVar46 + lVar13 + lVar17;
        lVar34 = lVar47 + lVar22 * local_118 + lVar13 * 4;
        lVar44 = lVar34 + 8;
        lVar35 = lVar18 + lVar13 * 4;
        lVar15 = lVar47 + 8 + lVar35;
        lVar30 = 0;
LAB_00159312:
        lVar28 = lVar20 >> 0x1e;
        iVar42 = (int)lVar30;
        iVar27 = (int)(lVar13 + 2);
        if (*(char *)(lVar9 + -1 + lVar30) == '\0') {
          if (*(char *)(lVar12 * lVar45 + lVar13 + lVar17 + 2 + lVar30) == '\0') {
            uVar19 = lVar13 + 2 + lVar30;
            lVar34 = lVar20 + 0x300000000 >> 0x20;
            if (*(char *)(lVar33 + lVar34) == '\0') {
              iVar27 = (int)uVar19;
              goto LAB_001597b0;
            }
            if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_001596d3;
            if (*(char *)(lVar16 + 4 + (lVar20 >> 0x20)) == '\0') {
              *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
              local_140 = uVar19 & 0xffffffff;
              goto LAB_001590f7;
            }
            local_140 = uVar19 & 0xffffffff;
LAB_001590ca:
            lVar34 = (long)(int)local_140;
            if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
              uVar40 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                    *(uint *)(lVar31 + 8 + lVar34 * 4));
            }
            else {
              uVar40 = *(uint *)(lVar31 + 8 + lVar34 * 4);
            }
            *(uint *)(lVar36 + lVar34 * 4) = uVar40;
            goto LAB_001591fa;
          }
          if (*(char *)(lVar9 + lVar30) == '\0') {
            uVar40 = iVar27 + iVar42;
            *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
            goto LAB_0015a755;
          }
          if (*(char *)(lVar8 + 3 + lVar30) != '\0') goto LAB_001596d0;
        }
        else {
          if (*(char *)(lVar8 + 3 + lVar30) != '\0') {
            *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
            uVar19 = (ulong)(uint)(iVar27 + iVar42);
            goto LAB_0015b7d0;
          }
          if (*(char *)(lVar9 + lVar30) == '\0') {
            iVar27 = iVar27 + iVar42;
            *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
            goto LAB_0015af31;
          }
        }
        if (*(char *)(lVar8 + 4 + lVar30) == '\0') {
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
          local_140 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_0015a7c2;
        }
        uVar40 = *(uint *)(lVar34 + 0x10 + lVar30 * 4);
        if (*(char *)(lVar12 * local_118 + lVar13 + lVar17 + 3 + lVar30) == '\0') {
          uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar15 + -8 + lVar30 * 4));
        }
        *(uint *)(lVar15 + lVar30 * 4) = uVar40;
        lVar20 = lVar20 + 0x200000000;
        lVar28 = lVar13 + lVar30;
        lVar30 = lVar30 + 2;
        if ((long)uVar25 <= lVar28 + 4) {
          iVar14 = iVar14 + (int)lVar30;
          uVar40 = iVar27 + (int)lVar30;
          goto LAB_0015941b;
        }
        goto LAB_00159312;
      }
      *(undefined4 *)(lVar30 + lVar44 * 4) = *(undefined4 *)(lVar47 + lVar35 + lVar44 * 4);
      lVar20 = lVar20 + 0x200000000;
      lVar28 = lVar34 + lVar44;
      lVar44 = lVar44 + 2;
      if ((long)uVar25 <= lVar28 + 2) {
        iVar14 = iVar14 + (int)lVar44;
        uVar40 = iVar27 + (int)lVar44;
        goto LAB_0015a8dd;
      }
      goto LAB_0015a84a;
    }
LAB_0015a8dd:
    uVar19 = (ulong)uVar40;
    if (local_180 < (int)uVar40) goto LAB_0015ae28;
    if (*(char *)(lVar33 + uVar19) == '\0') {
      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_0015ab47;
      if (*(char *)(lVar33 + 3 + (long)iVar14) == '\0') {
        uVar10 = *(undefined4 *)(lVar36 + (long)iVar14 * 4);
        goto LAB_0015ba34;
      }
    }
    lVar33 = (long)iVar14;
    if (*(char *)(lVar16 + 3 + lVar33) == '\0') {
      *(undefined4 *)(lVar36 + uVar19 * 4) = *(undefined4 *)(lVar36 + lVar33 * 4);
      goto LAB_0015ba76;
    }
    local_140 = uVar19;
    if (*(char *)(lVar29 + uVar19) == '\0') {
      uVar40 = *(uint *)(lVar31 + uVar19 * 4);
      uVar23 = *(uint *)(lVar36 + lVar33 * 4);
LAB_0015b2fd:
      uVar40 = RemSP::Merge(uVar40,uVar23);
      *(uint *)(lVar36 + uVar19 * 4) = uVar40;
      goto LAB_0015ba76;
    }
LAB_0015b22c:
    lVar33 = (long)(int)local_140;
    uVar19 = local_140;
    if (*(char *)(lVar33 + -2 + lVar16) == '\0') {
      uVar40 = *(uint *)(lVar31 + lVar33 * 4);
    }
    else {
LAB_0015b23a:
      lVar33 = (long)(int)uVar19;
      uVar40 = *(uint *)(lVar31 + lVar33 * 4);
      if (*(char *)(lVar29 + -1 + lVar33) != '\0') {
        *(uint *)(lVar36 + lVar33 * 4) = uVar40;
        goto LAB_0015ba76;
      }
    }
    uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar33 * 4));
    *(uint *)(lVar36 + lVar33 * 4) = uVar40;
    goto LAB_0015ba76;
  }
  if (local_180 < iVar27) {
LAB_0015a5bf:
    uVar40 = (uint)uVar19;
LAB_0015ae28:
    local_140 = (ulong)(int)uVar40;
    if (*(char *)(lVar33 + local_140) == '\0') {
LAB_0015ae32:
      if (*(char *)(lVar32 + local_140) == '\0') goto LAB_0015b9de;
    }
    uVar10 = *(undefined4 *)(lVar36 + -8 + local_140 * 4);
    goto LAB_0015ba6e;
  }
  uVar21 = uVar19 & 0xffffffff;
  if (*(char *)(lVar33 + uVar21) == '\0') {
    if (*(char *)(lVar32 + uVar21) == '\0') {
LAB_0015ab47:
      uVar40 = (uint)uVar19;
      local_140 = (ulong)(int)uVar40;
      if (*(char *)(local_140 + 1 + lVar33) == '\0') goto LAB_00159916;
      cVar1 = *(char *)(lVar16 + 1 + local_140);
      goto joined_r0x0015ab63;
    }
    if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_0015a5da;
  }
  else {
LAB_0015a5da:
    if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
      uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + lVar34 * 4));
LAB_0015a5fc:
      *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      goto LAB_0015ba76;
    }
  }
LAB_0015a742:
  *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
  goto LAB_0015ba76;
LAB_001596d0:
  uVar19 = (ulong)(uint)(iVar27 + iVar42);
LAB_001596d3:
  *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
LAB_0015adf3:
  lVar34 = (long)(int)uVar19;
  local_140 = lVar34 + 2;
  uVar40 = (uint)local_140;
  if (local_180 <= (int)uVar40) {
    if (local_180 < (int)uVar40) goto LAB_0015ae28;
    uVar21 = local_140 & 0xffffffff;
    if (*(char *)(lVar33 + uVar21) != '\0') goto LAB_0015ba19;
    if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_0015bc58;
    if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_0015ba19;
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
    goto LAB_0015ba76;
  }
  if (*(char *)(lVar33 + local_140) != '\0') goto LAB_0015ae85;
  if (*(char *)(lVar32 + local_140) == '\0') goto LAB_0015907b;
  if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
    *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
LAB_00159dd5:
    lVar34 = (long)(int)local_140;
    uVar21 = lVar34 + 2;
    iVar27 = (int)uVar21;
    if (iVar27 < local_180) {
      if (*(char *)(lVar33 + uVar21) == '\0') goto LAB_00159bd2;
      local_140 = uVar21;
      if (*(char *)(lVar32 + 1 + lVar34) != '\0') goto LAB_00159e13;
LAB_0015999a:
      iVar27 = (int)local_140;
      lVar34 = (long)iVar27;
      if (*(char *)(lVar34 + 1 + lVar16) == '\0') {
        if (*(char *)(lVar33 + 1 + lVar34) == '\0') {
          lVar34 = (long)iVar27;
          if (*(char *)(lVar16 + lVar34) != '\0') {
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
            goto LAB_0015a400;
          }
          if (*(char *)(lVar16 + -1 + lVar34) != '\0') {
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + -8 + lVar34 * 4);
            goto LAB_00159acb;
          }
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar40 = RemSP::length_ + 1;
          *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
          RemSP::length_ = uVar40;
          goto LAB_00159acb;
        }
        uVar21 = (ulong)iVar27;
        if (*(char *)(lVar16 + 2 + uVar21) == '\0') {
          if (*(char *)(lVar16 + uVar21) != '\0') {
            *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar31 + uVar21 * 4);
LAB_001590f7:
            lVar34 = (long)(int)local_140;
            uVar19 = lVar34 + 2;
            iVar27 = (int)uVar19;
            if (local_180 <= iVar27) {
              if (local_180 < iVar27) goto LAB_0015a5bf;
              uVar21 = uVar19 & 0xffffffff;
              if (*(char *)(lVar33 + uVar21) == '\0') {
                if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_0015ab47;
                if (*(char *)(lVar33 + 3 + lVar34) == '\0') goto LAB_0015a742;
              }
              if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_0015a742;
              if (*(char *)(lVar29 + uVar21) != '\0') goto LAB_0015b23a;
              uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + lVar34 * 4));
              goto LAB_0015a5fc;
            }
            if (*(char *)(lVar33 + uVar19) == '\0') {
              if (*(char *)(lVar32 + uVar19) == '\0') {
LAB_0015a689:
                iVar27 = (int)uVar19;
                lVar34 = (long)iVar27;
                if (*(char *)(lVar34 + 1 + lVar33) == '\0') {
LAB_001597b0:
                  uVar40 = RemSP::length_;
                  lVar34 = (long)iVar27;
                  if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
                    *(undefined4 *)(lVar36 + lVar34 * 4) = 0;
                    uVar21 = lVar34 + 2;
                    if (local_180 <= (int)uVar21) {
                      cVar1 = *(char *)(lVar33 + (uVar21 & 0xffffffff));
                      if (local_180 < (int)uVar21) {
                        if (cVar1 != '\0') goto LAB_00159fde;
                        goto LAB_0015988c;
                      }
                      if (cVar1 != '\0') goto LAB_00159fb7;
                      goto LAB_001598e0;
                    }
                    local_140 = uVar21;
                    if (*(char *)(lVar33 + uVar21) != '\0') goto LAB_0015999a;
LAB_0015903e:
                    lVar34 = (long)(int)local_140;
                    if (*(char *)(lVar32 + lVar34) == '\0') goto LAB_0015907b;
                    if (*(char *)(lVar33 + 1 + lVar34) == '\0') goto LAB_00159daa;
                    local_140 = local_140 & 0xffffffff;
                  }
                  else {
                    RemSP::P_[RemSP::length_] = RemSP::length_;
                    uVar23 = RemSP::length_ + 1;
                    *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
                    RemSP::length_ = uVar23;
                    uVar21 = lVar34 + 2;
                    iVar27 = (int)uVar21;
                    if (local_180 <= iVar27) {
                      uVar19 = uVar21 & 0xffffffff;
                      if (local_180 < iVar27) {
                        if (*(char *)(lVar33 + uVar19) != '\0') goto LAB_00159f23;
                        local_140 = (ulong)iVar27;
                        goto LAB_0015ae32;
                      }
                      if (*(char *)(lVar33 + uVar19) != '\0') {
                        uVar21 = uVar21 & 0xffffffff;
                        goto LAB_00159ed5;
                      }
                      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_001598fe;
                      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
                        *(uint *)(lVar36 + uVar19 * 4) = uVar40;
                        goto LAB_0015ba76;
                      }
                      uVar19 = (ulong)iVar27;
                      goto LAB_0015a03c;
                    }
                    if (*(char *)(lVar33 + uVar21) == '\0') {
                      if (*(char *)(lVar32 + uVar21) == '\0') {
                        local_140 = uVar21 & 0xffffffff;
                        goto LAB_0015907b;
                      }
                      if (*(char *)(lVar33 + 3 + lVar34) != '\0') {
                        local_140 = uVar21 & 0xffffffff;
                        goto LAB_00159bf2;
                      }
                      *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      local_140 = uVar21 & 0xffffffff;
                      goto LAB_00159dd5;
                    }
                    local_140 = uVar21 & 0xffffffff;
LAB_00159e13:
                    iVar27 = (int)local_140;
                    lVar34 = (long)iVar27;
                    if (*(char *)(lVar34 + 1 + lVar16) != '\0') {
                      uVar19 = local_140;
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') {
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                                *(uint *)(lVar36 + -8 + lVar34 * 4));
                          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                        }
                        else {
                          if (*(char *)(lVar29 + lVar34) == '\0') {
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                                  *(uint *)(lVar31 + lVar34 * 4));
                            uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                          }
                          else {
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                                  *(uint *)(lVar36 + -8 + lVar34 * 4));
                          }
                          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                          uVar19 = local_140 & 0xffffffff;
                        }
                      }
                      else {
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                              *(uint *)(lVar36 + -8 + lVar34 * 4));
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      goto LAB_0015b7d0;
                    }
                    if (*(char *)(lVar33 + 1 + lVar34) != '\0') {
                      if (*(char *)(lVar34 + 2 + lVar16) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') goto LAB_00159cc8;
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                              *(uint *)(lVar36 + -8 + lVar34 * 4));
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                        goto LAB_0015a7c2;
                      }
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') {
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                *(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        else {
                          if (*(char *)(lVar29 + 1 + lVar34) != '\0') {
                            if (*(char *)(lVar29 + lVar34) == '\0') {
                              uVar40 = *(uint *)(lVar31 + -8 + lVar34 * 4);
                              goto LAB_0015a2ed;
                            }
                            goto LAB_00159f90;
                          }
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                                *(uint *)(lVar31 + 8 + lVar34 * 4));
                          uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      else {
                        if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
                          uVar40 = *(uint *)(lVar31 + lVar34 * 4);
LAB_0015a2ed:
                          uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar31 + 8 + lVar34 * 4));
                          uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        else {
LAB_00159f90:
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                *(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      goto LAB_001591fa;
                    }
                    uVar21 = (ulong)iVar27;
                    if (*(char *)(lVar16 + -1 + uVar21) == '\0') goto LAB_0015a25d;
                    uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + uVar21 * 4),
                                          *(uint *)(lVar36 + -8 + uVar21 * 4));
                    *(uint *)(lVar36 + uVar21 * 4) = uVar40;
LAB_0015af31:
                    lVar34 = (long)iVar27;
                    local_140 = lVar34 + 2;
                    uVar21 = local_140;
                    if (local_180 <= (int)local_140) {
                      uVar49 = local_140 & 0xffffffff;
                      if (local_180 < (int)local_140) {
                        if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_0015affa:
                          iVar27 = (int)local_140;
                          goto LAB_0015afff;
                        }
                        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_0015afed:
                          uVar21 = uVar21 & 0xffffffff;
LAB_0015aff0:
                          uVar40 = (uint)uVar21;
                          goto LAB_00158fd4;
                        }
                      }
                      else {
                        if (*(char *)(lVar33 + uVar49) == '\0') {
                          if (*(char *)(lVar32 + uVar49) == '\0') {
LAB_0015b2de:
                            uVar21 = local_140 & 0xffffffff;
                            goto LAB_001598fe;
                          }
                          if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
LAB_0015b2d1:
                            iVar27 = (int)uVar21;
                            goto LAB_0015b00c;
                          }
                        }
                        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_0015b0bb:
                          uVar40 = (uint)local_140;
                          goto LAB_00158f5c;
                        }
                        if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
                          if (*(char *)(lVar16 + lVar34) == '\0') {
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar49 * 4),
                                                  *(uint *)(lVar36 + lVar34 * 4));
                            *(uint *)(lVar36 + uVar49 * 4) = uVar40;
                            goto LAB_0015ba76;
                          }
LAB_0015b09e:
                          uVar19 = (ulong)(int)local_140;
                          if (*(char *)(lVar29 + -1 + uVar19) != '\0') goto LAB_0015ba24;
                          uVar40 = *(uint *)(lVar31 + uVar19 * 4);
                          uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
                          goto LAB_0015b2fd;
                        }
                      }
                      if (*(char *)(lVar16 + uVar49) != '\0') goto LAB_0015b22c;
                      *(undefined4 *)(lVar36 + uVar49 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
                      goto LAB_0015ba76;
                    }
                    uVar19 = local_140;
                    if (*(char *)(lVar33 + local_140) != '\0') {
                      if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_00158f90;
                      if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
                        if (*(char *)(lVar16 + lVar34) == '\0') {
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                          goto LAB_0015b7d0;
                        }
LAB_0015af73:
                        if (*(char *)(lVar29 + -1 + uVar21) != '\0') goto LAB_0015ae9d;
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                              *(uint *)(lVar36 + -8 + uVar21 * 4));
                        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                        uVar19 = uVar21;
                        goto LAB_0015b7d0;
                      }
                      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + local_140) == '\0') goto LAB_0015b4a7;
                        if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_0015b483;
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                              *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
LAB_0015a400:
                        while( true ) {
                          lVar34 = (long)(int)local_140;
                          uVar21 = lVar34 + 2;
                          local_140 = uVar21;
                          uVar19 = uVar21;
                          if (local_180 <= (int)uVar21) break;
                          if (*(char *)(lVar33 + uVar21) == '\0') {
                            if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_0015b1bd;
                            if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_00159d94;
                            if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0015908d;
                            if (*(char *)(lVar16 + 3 + lVar34) != '\0') goto LAB_0015b15f;
LAB_0015a4e3:
                            if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
                              if (*(char *)(lVar16 + uVar21) == '\0') goto LAB_0015b4ed;
                              goto LAB_0015b4c6;
                            }
                            if (*(char *)(lVar29 + 3 + lVar34) != '\0') goto LAB_0015b350;
                            if (*(char *)(lVar16 + uVar21) != '\0') goto LAB_0015b5ee;
                            goto LAB_0015b4f9;
                          }
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_00158f90;
                          if (*(char *)(lVar34 + 3 + lVar16) != '\0') goto LAB_0015af73;
                          if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_0015a4e3;
                          if (*(char *)(lVar16 + uVar21) == '\0') {
LAB_0015b4a7:
                            *(undefined4 *)(lVar36 + 8 + lVar34 * 4) =
                                 *(undefined4 *)(lVar36 + lVar34 * 4);
                            local_140 = uVar21;
LAB_00159acb:
                            while( true ) {
                              lVar34 = (long)(int)local_140;
                              uVar21 = lVar34 + 2;
                              iVar27 = (int)uVar21;
                              if (local_180 <= iVar27) {
                                uVar49 = uVar21 & 0xffffffff;
                                if (iVar27 <= local_180) {
                                  if (*(char *)(lVar33 + uVar49) == '\0') goto LAB_0015a009;
                                  uVar19 = (ulong)iVar27;
                                  goto LAB_0015a02a;
                                }
                                if (*(char *)(lVar33 + uVar49) == '\0') {
                                  local_140 = uVar21 & 0xffffffff;
                                  goto LAB_0015affa;
                                }
                                if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0015aff0;
                                uVar19 = (ulong)iVar27;
                                goto LAB_0015a047;
                              }
                              if (*(char *)(lVar33 + uVar21) == '\0') goto LAB_00159bd2;
                              if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_00158f90;
                              if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
                                uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                      *(uint *)(lVar36 + lVar34 * 4));
                                *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                                uVar19 = uVar21 & 0xffffffff;
                                goto LAB_0015b7d0;
                              }
                              local_140 = uVar21;
                              if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_00159c5e;
LAB_0015a25d:
                              local_140 = local_140 & 0xffffffff;
                              if (*(char *)(lVar16 + uVar21) != '\0') break;
                              *(undefined4 *)(lVar36 + uVar21 * 4) =
                                   *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
                            }
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                                  *(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
LAB_0015b483:
                            uVar40 = *(uint *)(lVar31 + local_140 * 4);
                            if (*(char *)(lVar29 + -1 + local_140) == '\0') {
                              uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + local_140 * 4));
                              *(uint *)(lVar36 + local_140 * 4) = uVar40;
                            }
                            else {
                              *(uint *)(lVar36 + local_140 * 4) = uVar40;
                            }
                          }
                        }
                        uVar49 = uVar21 & 0xffffffff;
                        if (local_180 < (int)uVar21) {
                          if (*(char *)(lVar33 + uVar49) == '\0') goto LAB_0015affa;
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0015afed;
                        }
                        else {
                          if (*(char *)(lVar33 + uVar49) == '\0') {
                            if (*(char *)(lVar32 + uVar49) == '\0') goto LAB_0015b2de;
                            if (*(char *)(lVar33 + 3 + lVar34) == '\0') goto LAB_0015b2d1;
                          }
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0015b0bb;
                          if (*(char *)(lVar16 + 3 + lVar34) != '\0') goto LAB_0015b09e;
                        }
                        if (*(char *)(lVar16 + uVar49) != '\0') goto LAB_0015b23a;
                        *(undefined4 *)(lVar36 + uVar49 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
                        goto LAB_0015ba76;
                      }
LAB_0015b329:
                      if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
                        if (*(char *)(lVar16 + 2 + lVar34) == '\0') {
LAB_0015b4ed:
                          *(undefined4 *)(lVar36 + 8 + lVar34 * 4) =
                               *(undefined4 *)(lVar36 + lVar34 * 4);
                          goto LAB_0015a792;
                        }
                        if (*(char *)(lVar16 + lVar34) == '\0') {
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                        }
                        else {
LAB_0015b4c6:
                          local_140 = uVar21 & 0xffffffff;
                          uVar40 = *(uint *)(lVar31 + uVar21 * 4);
                          if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                            uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                        }
                        goto LAB_001590f7;
                      }
                      if (*(char *)(lVar29 + 3 + lVar34) != '\0') {
                        if (*(char *)(lVar16 + lVar34) == '\0') {
LAB_0015b4f9:
                          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),
                                                *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                          goto LAB_001591fa;
                        }
LAB_0015b350:
                        local_140 = uVar21 & 0xffffffff;
                        if (*(char *)(lVar29 + -1 + uVar21) != '\0') goto LAB_0015aeee;
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),
                                              *(uint *)(lVar36 + -8 + uVar21 * 4));
                        goto LAB_0015aefd;
                      }
                      if (*(char *)(lVar16 + local_140) == '\0') {
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),
                                              *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      }
                      else {
                        if (*(char *)(lVar16 + lVar34) != '\0') {
LAB_0015b5ee:
                          local_140 = uVar21 & 0xffffffff;
                          if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                                  *(uint *)(lVar31 + 8 + uVar21 * 4));
                            uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
                            uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),
                                                  *(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          goto LAB_001591fa;
                        }
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                              *(uint *)(lVar31 + 0x10 + lVar34 * 4));
                        uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      }
                      local_140 = local_140 & 0xffffffff;
                      goto LAB_001591fa;
                    }
                    if (*(char *)(lVar32 + local_140) == '\0') {
LAB_0015b1bd:
                      local_140 = local_140 & 0xffffffff;
                      goto LAB_0015907b;
                    }
                    if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_00159d94;
                    if (*(char *)(lVar32 + 1 + lVar34) != '\0') {
                      if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_0015b329;
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                              *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                        goto LAB_0015adf3;
                      }
LAB_0015b15f:
                      uVar19 = local_140;
                      if (*(char *)(lVar29 + -1 + local_140) != '\0') goto LAB_0015bb3a;
                      uVar40 = RemSP::Merge(*(uint *)(lVar31 + local_140 * 4),
                                            *(uint *)(lVar36 + -8 + local_140 * 4));
                      *(uint *)(lVar36 + local_140 * 4) = uVar40;
                      goto LAB_0015adf3;
                    }
                  }
                  goto LAB_0015908d;
                }
                if (*(char *)(lVar16 + 1 + lVar34) != '\0') {
                  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
                  goto LAB_0015adf3;
                }
                if (*(char *)(lVar34 + 2 + lVar16) != '\0') {
                  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + 8 + lVar34 * 4);
                  local_140 = uVar19 & 0xffffffff;
                  goto LAB_001591fa;
                }
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar40 = RemSP::length_ + 1;
                *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
                RemSP::length_ = uVar40;
LAB_0015a792:
                local_140 = uVar19 & 0xffffffff;
                goto LAB_0015a549;
              }
              if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_0015a74e;
              if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_001594c6;
              uVar21 = uVar19;
              if (*(char *)(lVar29 + uVar19) == '\0') {
                uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                      *(uint *)(lVar36 + lVar34 * 4));
                *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
              }
              else {
LAB_0015abcc:
                uVar40 = *(uint *)(lVar31 + uVar21 * 4);
                if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                  uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                }
                else {
                  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                }
              }
              goto LAB_0015adf3;
            }
            if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
              uVar21 = uVar19;
              if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_00159132;
              uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                    *(uint *)(lVar36 + lVar34 * 4));
              *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
              goto LAB_0015b7d0;
            }
            if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
              *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
              goto LAB_0015af31;
            }
LAB_001594c6:
            if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
              *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
              local_140 = uVar19 & 0xffffffff;
              goto LAB_0015a7c2;
            }
            if (*(char *)(lVar29 + 3 + lVar34) == '\0') {
              uVar40 = *(uint *)(lVar31 + 0x10 + lVar34 * 4);
            }
            else {
              local_140 = uVar19;
              if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_0015a9a9;
              uVar40 = *(uint *)(lVar31 + 0x10 + lVar34 * 4);
            }
            uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + lVar34 * 4));
            *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
            local_140 = uVar19 & 0xffffffff;
            goto LAB_001591fa;
          }
          if (*(char *)(lVar16 + -1 + uVar21) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar40 = RemSP::length_ + 1;
            *(uint *)(lVar36 + uVar21 * 4) = RemSP::length_;
            RemSP::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar31 + -8 + uVar21 * 4);
          }
          goto LAB_0015a549;
        }
        if (*(char *)(lVar16 + uVar21) != '\0') goto LAB_001590ca;
        if (*(char *)(lVar16 + -1 + uVar21) != '\0') goto LAB_0015be3d;
        goto LAB_0015aef9;
      }
      if ((*(char *)(lVar16 + lVar34) != '\0') || (*(char *)(lVar16 + -1 + lVar34) == '\0')) {
        *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
        uVar19 = local_140 & 0xffffffff;
        goto LAB_0015b7d0;
      }
      uVar19 = local_140 & 0xffffffff;
      goto LAB_0015bbfa;
    }
    uVar49 = uVar21 & 0xffffffff;
    if (local_180 < iVar27) {
      if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_0015afff:
        if (*(char *)(lVar32 + uVar49) == '\0') {
          *(undefined4 *)(lVar36 + uVar49 * 4) = 0;
        }
        else {
LAB_0015b00c:
          lVar33 = (long)iVar27;
          if (*(char *)(lVar32 + -1 + lVar33) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar40 = RemSP::length_ + 1;
            *(uint *)(lVar36 + lVar33 * 4) = RemSP::length_;
            RemSP::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar36 + lVar33 * 4) = *(undefined4 *)(lVar36 + -8 + lVar33 * 4);
          }
        }
        goto LAB_0015ba76;
      }
      if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_00159fde:
        local_140 = (ulong)(int)uVar21;
        if (*(char *)(lVar16 + local_140) != '\0') goto LAB_00158fe2;
        if (*(char *)(lVar16 + -1 + local_140) == '\0') goto LAB_00159924;
        uVar10 = *(undefined4 *)(lVar31 + -8 + local_140 * 4);
        goto LAB_0015ba6e;
      }
LAB_00159f23:
      uVar19 = (ulong)iVar27;
      if (*(char *)(lVar16 + -1 + uVar19) == '\0') goto LAB_0015a047;
      uVar40 = *(uint *)(lVar31 + -8 + uVar19 * 4);
    }
    else {
      if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_0015a009:
        iVar27 = (int)uVar21;
        if (*(char *)(lVar32 + uVar49) == '\0') goto LAB_001598fe;
        uVar19 = (ulong)iVar27;
        if (*(char *)(lVar33 + 1 + uVar19) == '\0') goto LAB_0015b00c;
LAB_0015a02a:
        uVar40 = (uint)uVar21;
        if (*(char *)(lVar32 + -1 + uVar19) == '\0') goto LAB_00158f5c;
LAB_0015a03c:
        if (*(char *)(lVar16 + 1 + uVar19) == '\0') {
LAB_0015a047:
          if (*(char *)(lVar16 + uVar19) == '\0') {
            *(undefined4 *)(lVar36 + uVar19 * 4) = *(undefined4 *)(lVar36 + -8 + uVar19 * 4);
            goto LAB_0015ba76;
          }
        }
      }
      else {
        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_00159fb7:
          uVar19 = (ulong)(int)uVar21;
          if (*(char *)(lVar16 + 1 + uVar19) == '\0') goto LAB_00159fde;
          if ((*(char *)(lVar16 + uVar19) != '\0') || (*(char *)(lVar16 + -1 + uVar19) == '\0'))
          goto LAB_0015ba2b;
          goto LAB_0015b985;
        }
LAB_00159ed5:
        iVar27 = (int)uVar21;
        uVar19 = (ulong)iVar27;
        if (*(char *)(lVar16 + 1 + uVar19) == '\0') goto LAB_00159f23;
        if (*(char *)(lVar16 + uVar19) == '\0') {
          if (*(char *)(lVar16 + -1 + uVar19) == '\0') {
            uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar19 * 4),*(uint *)(lVar36 + -8 + uVar19 * 4)
                                 );
            *(uint *)(lVar36 + uVar19 * 4) = uVar40;
          }
          else {
            if (*(char *)(lVar29 + uVar19) == '\0') {
              uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + uVar19 * 4),
                                    *(uint *)(lVar31 + uVar19 * 4));
              uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
            }
            else {
              uVar40 = *(uint *)(lVar31 + uVar19 * 4);
              uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
            }
            uVar40 = RemSP::Merge(uVar40,uVar23);
            *(uint *)(lVar36 + uVar19 * 4) = uVar40;
          }
          goto LAB_0015ba76;
        }
      }
      uVar40 = *(uint *)(lVar31 + uVar19 * 4);
    }
    uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
    goto LAB_0015a05c;
  }
  uVar21 = local_140;
  uVar19 = local_140 & 0xffffffff;
LAB_0015bb2b:
  local_140 = uVar19 & 0xffffffff;
  if (*(char *)(lVar16 + 1 + uVar21) == '\0') goto LAB_0015aebe;
LAB_0015bb3a:
  lVar34 = (long)(int)uVar19;
  if (*(char *)(lVar16 + lVar34) == '\0') {
    uVar40 = *(uint *)(lVar31 + lVar34 * 4);
    if (*(char *)(lVar29 + lVar34) != '\0') {
      *(uint *)(lVar36 + lVar34 * 4) = uVar40;
      goto LAB_0015adf3;
    }
    uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
  }
  else {
    uVar40 = *(uint *)(lVar31 + lVar34 * 4);
  }
  *(uint *)(lVar36 + lVar34 * 4) = uVar40;
  goto LAB_0015adf3;
LAB_0015ae85:
  iVar27 = (int)local_140;
  uVar21 = (ulong)iVar27;
  if (*(char *)(uVar21 + 1 + lVar16) != '\0') {
    uVar21 = local_140 & 0xffffffff;
LAB_0015ae9d:
    lVar34 = (long)(int)uVar21;
    uVar19 = uVar21;
    if (*(char *)(lVar16 + lVar34) == '\0') {
      uVar40 = *(uint *)(lVar31 + lVar34 * 4);
      if (*(char *)(lVar29 + lVar34) != '\0') {
        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
        goto LAB_0015b7d0;
      }
      uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
    }
    else {
      uVar40 = *(uint *)(lVar31 + lVar34 * 4);
    }
    *(uint *)(lVar36 + lVar34 * 4) = uVar40;
    goto LAB_0015b7d0;
  }
  if (*(char *)(lVar33 + 1 + uVar21) == '\0') {
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
    goto LAB_0015af31;
  }
LAB_0015aebe:
  if (*(char *)(lVar16 + 2 + uVar21) == '\0') {
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
    goto LAB_0015a7c2;
  }
LAB_0015aed4:
  if (*(char *)(lVar29 + 1 + uVar21) == '\0') {
    uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),*(uint *)(lVar36 + -8 + uVar21 * 4));
    *(uint *)(lVar36 + uVar21 * 4) = uVar40;
  }
  else {
LAB_0015aeee:
    if (*(char *)(lVar16 + uVar21) == '\0') {
      uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
      if (*(char *)(lVar29 + uVar21) == '\0') {
        uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      }
      else {
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      }
    }
    else {
LAB_0015aef9:
      uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
LAB_0015aefd:
      *(uint *)(lVar36 + uVar21 * 4) = uVar40;
    }
  }
  goto LAB_001591fa;
LAB_0015a74e:
  uVar40 = (uint)uVar19;
  *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
LAB_0015a755:
  local_140 = (ulong)uVar40;
  goto LAB_00159dd5;
LAB_00159bd2:
  local_140 = uVar21 & 0xffffffff;
  uVar21 = (ulong)(int)uVar21;
  if (*(char *)(lVar32 + uVar21) != '\0') {
    if (*(char *)(lVar33 + 1 + uVar21) == '\0') {
LAB_00159d94:
      lVar34 = (long)(int)local_140;
      if (*(char *)(lVar32 + -1 + lVar34) == '\0') {
LAB_00159daa:
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar40 = RemSP::length_ + 1;
        *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
        RemSP::length_ = uVar40;
      }
      else {
        *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar36 + -8 + lVar34 * 4);
      }
      goto LAB_00159dd5;
    }
    if (*(char *)(lVar32 + -1 + uVar21) != '\0') {
LAB_00159bf2:
      if (*(char *)(lVar16 + 1 + uVar21) != '\0') {
        uVar40 = RemSP::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + -8 + uVar21 * 4));
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
        uVar19 = local_140;
        goto LAB_0015adf3;
      }
LAB_00159c5e:
      lVar34 = (long)(int)local_140;
      if (*(char *)(lVar34 + 2 + lVar16) != '\0') {
        if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
          if (*(char *)(lVar16 + lVar34) == '\0') {
            uVar23 = *(uint *)(lVar31 + 8 + lVar34 * 4);
            uVar40 = *(uint *)(lVar36 + -8 + lVar34 * 4);
          }
          else {
            uVar23 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),*(uint *)(lVar31 + 8 + lVar34 * 4))
            ;
            uVar40 = *(uint *)(lVar36 + -8 + lVar34 * 4);
          }
          uVar40 = RemSP::Merge(uVar23,uVar40);
          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          local_140 = local_140 & 0xffffffff;
        }
        else {
          uVar40 = RemSP::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                *(uint *)(lVar36 + -8 + lVar34 * 4));
          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          local_140 = local_140 & 0xffffffff;
        }
        goto LAB_001591fa;
      }
      local_140 = local_140 & 0xffffffff;
LAB_00159cc8:
      if (*(char *)(lVar16 + lVar34) != '\0') {
        uVar40 = RemSP::Merge(*(uint *)(lVar31 + lVar34 * 4),*(uint *)(lVar36 + -8 + lVar34 * 4));
        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
        goto LAB_001590f7;
      }
      *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar36 + -8 + lVar34 * 4);
      goto LAB_0015a549;
    }
    goto LAB_0015908d;
  }
LAB_0015907b:
  iVar27 = (int)local_140;
  local_140 = local_140 & 0xffffffff;
  if (*(char *)(lVar33 + 1 + (long)iVar27) != '\0') goto LAB_0015908d;
  goto LAB_001597b0;
LAB_0015908d:
  lVar34 = (long)(int)local_140;
  if (*(char *)(lVar16 + 1 + lVar34) != '\0') {
    *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
    uVar19 = local_140;
    goto LAB_0015adf3;
  }
LAB_001590a8:
  lVar34 = (long)(int)local_140;
  if (*(char *)(lVar16 + 2 + lVar34) != '\0') {
    if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_001590ca;
    *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + 8 + lVar34 * 4);
    goto LAB_001591fa;
  }
  if (*(char *)(lVar16 + lVar34) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar40 = RemSP::length_ + 1;
    *(uint *)(lVar36 + lVar34 * 4) = RemSP::length_;
    RemSP::length_ = uVar40;
    goto LAB_0015a549;
  }
  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
  goto LAB_001590f7;
LAB_0015be3d:
  if ((*(char *)(lVar29 + 1 + uVar21) == '\0') || (*(char *)(lVar29 + uVar21) == '\0')) {
    uVar40 = RemSP::Merge(*(uint *)(lVar31 + -8 + uVar21 * 4),*(uint *)(lVar31 + 8 + uVar21 * 4));
  }
  else {
    uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
  }
  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
  goto LAB_001591fa;
code_r0x0015c623:
  if (*(char *)(lVar15 + lVar44) == '\0') {
    *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar46 + (lVar13 >> 0x1e));
    uVar26 = (ulong)(uint)(iVar14 + iVar42);
    goto LAB_0015c795;
  }
  uVar40 = *(uint *)(lVar8 + lVar44 * 4);
  if (*(char *)(lVar17 + lVar30 + lVar44) == '\0') {
    uVar40 = RemSP::Merge(uVar40,*(uint *)(lVar9 + -8 + lVar44 * 4));
  }
  *(uint *)(lVar9 + lVar44 * 4) = uVar40;
  lVar13 = lVar13 + 0x200000000;
  lVar20 = lVar30 + lVar44;
  lVar44 = lVar44 + 2;
  if ((long)uVar25 <= lVar20 + 4) {
    uVar40 = iVar27 + (int)lVar44 + 2;
    iVar27 = iVar27 + (int)lVar44;
    goto LAB_0015cdf6;
  }
  goto LAB_0015c600;
code_r0x0015cabb:
  *(undefined4 *)(lVar30 + lVar13 * 4) = *(undefined4 *)(lVar44 + lVar13 * 4);
  lVar28 = lVar9 + lVar13;
  lVar13 = lVar13 + 2;
  if ((long)uVar25 <= lVar28 + 2) {
    iVar14 = iVar27 + (int)lVar13 + 2;
    iVar27 = iVar27 + (int)lVar13;
    goto LAB_0015ce34;
  }
  goto LAB_0015ca96;
LAB_0015c567:
  *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + 8 + uVar21 * 4);
  goto LAB_0015c597;
LAB_00158a57:
  uVar10 = 0;
LAB_00158a6c:
  *(undefined4 *)(lVar46 + lVar33 * 4) = uVar10;
LAB_00158a70:
  uVar40 = uVar38 + 2;
  uVar25 = (ulong)uVar40;
  if ((int)uVar23 <= (int)uVar40) goto LAB_00158a7f;
  goto LAB_001589c1;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}